

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  byte bVar47;
  ulong uVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  ulong uVar52;
  byte bVar53;
  ulong unaff_R13;
  long lVar54;
  undefined1 uVar55;
  bool bVar56;
  undefined1 uVar57;
  bool bVar58;
  ulong uVar59;
  uint uVar60;
  uint uVar110;
  uint uVar111;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar113;
  uint uVar114;
  uint uVar115;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  uint uVar112;
  uint uVar116;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar117;
  vint4 bi_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  vint4 ai_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  vint4 ai;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined4 uVar199;
  float fVar200;
  float fVar207;
  float fVar208;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [32];
  vint4 ai_1;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined4 uVar221;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined4 uVar222;
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar224 [28];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined4 uVar235;
  undefined4 uVar236;
  undefined4 uVar237;
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_874;
  ulong local_870;
  ulong local_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined1 auStack_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  ulong local_7d8;
  uint local_7cc;
  uint local_7c8;
  undefined4 local_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  uint local_5b4;
  uint local_5b0;
  Primitive *local_598;
  ulong local_590;
  ulong local_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar103 [32];
  
  PVar3 = prim[1];
  uVar52 = (ulong)(byte)PVar3;
  fVar200 = *(float *)(prim + uVar52 * 0x19 + 0x12);
  auVar64 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar52 * 0x19 + 6));
  auVar155._0_4_ = fVar200 * (ray->dir).field_0.m128[0];
  auVar155._4_4_ = fVar200 * (ray->dir).field_0.m128[1];
  auVar155._8_4_ = fVar200 * (ray->dir).field_0.m128[2];
  auVar155._12_4_ = fVar200 * (ray->dir).field_0.m128[3];
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 4 + 6)));
  auVar201._0_4_ = fVar200 * auVar64._0_4_;
  auVar201._4_4_ = fVar200 * auVar64._4_4_;
  auVar201._8_4_ = fVar200 * auVar64._8_4_;
  auVar201._12_4_ = fVar200 * auVar64._12_4_;
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 5 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 6 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0xb + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar52 + 6)));
  uVar59 = (ulong)(uint)((int)(uVar52 * 9) * 2);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + uVar52 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar48 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar239._4_4_ = auVar155._0_4_;
  auVar239._0_4_ = auVar155._0_4_;
  auVar239._8_4_ = auVar155._0_4_;
  auVar239._12_4_ = auVar155._0_4_;
  auVar13 = vshufps_avx(auVar155,auVar155,0x55);
  auVar61 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar200 = auVar61._0_4_;
  auVar186._0_4_ = fVar200 * auVar68._0_4_;
  fVar207 = auVar61._4_4_;
  auVar186._4_4_ = fVar207 * auVar68._4_4_;
  fVar208 = auVar61._8_4_;
  auVar186._8_4_ = fVar208 * auVar68._8_4_;
  fVar209 = auVar61._12_4_;
  auVar186._12_4_ = fVar209 * auVar68._12_4_;
  auVar136._0_4_ = auVar70._0_4_ * fVar200;
  auVar136._4_4_ = auVar70._4_4_ * fVar207;
  auVar136._8_4_ = auVar70._8_4_ * fVar208;
  auVar136._12_4_ = auVar70._12_4_ * fVar209;
  auVar118._0_4_ = auVar72._0_4_ * fVar200;
  auVar118._4_4_ = auVar72._4_4_ * fVar207;
  auVar118._8_4_ = auVar72._8_4_ * fVar208;
  auVar118._12_4_ = auVar72._12_4_ * fVar209;
  auVar61 = vfmadd231ps_fma(auVar186,auVar13,auVar64);
  auVar63 = vfmadd231ps_fma(auVar136,auVar13,auVar66);
  auVar13 = vfmadd231ps_fma(auVar118,auVar71,auVar13);
  auVar62 = vfmadd231ps_fma(auVar61,auVar239,auVar65);
  auVar63 = vfmadd231ps_fma(auVar63,auVar239,auVar69);
  auVar118 = vfmadd231ps_fma(auVar13,auVar67,auVar239);
  auVar240._4_4_ = auVar201._0_4_;
  auVar240._0_4_ = auVar201._0_4_;
  auVar240._8_4_ = auVar201._0_4_;
  auVar240._12_4_ = auVar201._0_4_;
  auVar13 = vshufps_avx(auVar201,auVar201,0x55);
  auVar61 = vshufps_avx(auVar201,auVar201,0xaa);
  fVar200 = auVar61._0_4_;
  auVar202._0_4_ = fVar200 * auVar68._0_4_;
  fVar207 = auVar61._4_4_;
  auVar202._4_4_ = fVar207 * auVar68._4_4_;
  fVar208 = auVar61._8_4_;
  auVar202._8_4_ = fVar208 * auVar68._8_4_;
  fVar209 = auVar61._12_4_;
  auVar202._12_4_ = fVar209 * auVar68._12_4_;
  auVar179._0_4_ = auVar70._0_4_ * fVar200;
  auVar179._4_4_ = auVar70._4_4_ * fVar207;
  auVar179._8_4_ = auVar70._8_4_ * fVar208;
  auVar179._12_4_ = auVar70._12_4_ * fVar209;
  auVar156._0_4_ = auVar72._0_4_ * fVar200;
  auVar156._4_4_ = auVar72._4_4_ * fVar207;
  auVar156._8_4_ = auVar72._8_4_ * fVar208;
  auVar156._12_4_ = auVar72._12_4_ * fVar209;
  auVar64 = vfmadd231ps_fma(auVar202,auVar13,auVar64);
  auVar68 = vfmadd231ps_fma(auVar179,auVar13,auVar66);
  auVar66 = vfmadd231ps_fma(auVar156,auVar13,auVar71);
  auVar70 = vfmadd231ps_fma(auVar64,auVar240,auVar65);
  auVar71 = vfmadd231ps_fma(auVar68,auVar240,auVar69);
  auVar72 = vfmadd231ps_fma(auVar66,auVar240,auVar67);
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar65 = vandps_avx(auVar219,auVar62);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar65,auVar213,1);
  bVar58 = (bool)((byte)uVar59 & 1);
  auVar61._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar62._0_4_;
  bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar62._4_4_;
  bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar62._8_4_;
  bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar62._12_4_;
  auVar65 = vandps_avx(auVar219,auVar63);
  uVar59 = vcmpps_avx512vl(auVar65,auVar213,1);
  bVar58 = (bool)((byte)uVar59 & 1);
  auVar62._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar63._0_4_;
  bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar63._4_4_;
  bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar63._8_4_;
  bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar63._12_4_;
  auVar65 = vandps_avx(auVar219,auVar118);
  uVar59 = vcmpps_avx512vl(auVar65,auVar213,1);
  bVar58 = (bool)((byte)uVar59 & 1);
  auVar63._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar118._0_4_;
  bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar118._4_4_;
  bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar118._8_4_;
  bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar118._12_4_;
  auVar64 = vrcp14ps_avx512vl(auVar61);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = &DAT_3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar65 = vfnmadd213ps_fma(auVar61,auVar64,auVar214);
  auVar69 = vfmadd132ps_fma(auVar65,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar62);
  auVar65 = vfnmadd213ps_fma(auVar62,auVar64,auVar214);
  auVar66 = vfmadd132ps_fma(auVar65,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar63);
  auVar65 = vfnmadd213ps_fma(auVar63,auVar64,auVar214);
  auVar67 = vfmadd132ps_fma(auVar65,auVar64,auVar64);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar52 * 7 + 6);
  auVar65 = vpmovsxwd_avx(auVar65);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar68 = vsubps_avx(auVar65,auVar70);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar52 * 9 + 6);
  auVar65 = vpmovsxwd_avx(auVar64);
  auVar194._0_4_ = auVar69._0_4_ * auVar68._0_4_;
  auVar194._4_4_ = auVar69._4_4_ * auVar68._4_4_;
  auVar194._8_4_ = auVar69._8_4_ * auVar68._8_4_;
  auVar194._12_4_ = auVar69._12_4_ * auVar68._12_4_;
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar70);
  auVar187._0_4_ = auVar69._0_4_ * auVar65._0_4_;
  auVar187._4_4_ = auVar69._4_4_ * auVar65._4_4_;
  auVar187._8_4_ = auVar69._8_4_ * auVar65._8_4_;
  auVar187._12_4_ = auVar69._12_4_ * auVar65._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar64 = vpmovsxwd_avx(auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar52 * -2 + 6);
  auVar65 = vpmovsxwd_avx(auVar69);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar71);
  auVar215._0_4_ = auVar66._0_4_ * auVar65._0_4_;
  auVar215._4_4_ = auVar66._4_4_ * auVar65._4_4_;
  auVar215._8_4_ = auVar66._8_4_ * auVar65._8_4_;
  auVar215._12_4_ = auVar66._12_4_ * auVar65._12_4_;
  auVar65 = vcvtdq2ps_avx(auVar64);
  auVar65 = vsubps_avx(auVar65,auVar71);
  auVar137._0_4_ = auVar66._0_4_ * auVar65._0_4_;
  auVar137._4_4_ = auVar66._4_4_ * auVar65._4_4_;
  auVar137._8_4_ = auVar66._8_4_ * auVar65._8_4_;
  auVar137._12_4_ = auVar66._12_4_ * auVar65._12_4_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar48 + uVar52 + 6);
  auVar65 = vpmovsxwd_avx(auVar66);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar72);
  auVar180._0_4_ = auVar67._0_4_ * auVar65._0_4_;
  auVar180._4_4_ = auVar67._4_4_ * auVar65._4_4_;
  auVar180._8_4_ = auVar67._8_4_ * auVar65._8_4_;
  auVar180._12_4_ = auVar67._12_4_ * auVar65._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar52 * 0x17 + 6);
  auVar65 = vpmovsxwd_avx(auVar70);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,auVar72);
  auVar119._0_4_ = auVar67._0_4_ * auVar65._0_4_;
  auVar119._4_4_ = auVar67._4_4_ * auVar65._4_4_;
  auVar119._8_4_ = auVar67._8_4_ * auVar65._8_4_;
  auVar119._12_4_ = auVar67._12_4_ * auVar65._12_4_;
  auVar65 = vpminsd_avx(auVar194,auVar187);
  auVar64 = vpminsd_avx(auVar215,auVar137);
  auVar65 = vmaxps_avx(auVar65,auVar64);
  auVar64 = vpminsd_avx(auVar180,auVar119);
  uVar199 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar67._4_4_ = uVar199;
  auVar67._0_4_ = uVar199;
  auVar67._8_4_ = uVar199;
  auVar67._12_4_ = uVar199;
  auVar64 = vmaxps_avx512vl(auVar64,auVar67);
  auVar65 = vmaxps_avx(auVar65,auVar64);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar65,auVar71);
  auVar65 = vpmaxsd_avx(auVar194,auVar187);
  auVar64 = vpmaxsd_avx(auVar215,auVar137);
  auVar65 = vminps_avx(auVar65,auVar64);
  auVar64 = vpmaxsd_avx(auVar180,auVar119);
  fVar200 = ray->tfar;
  auVar72._4_4_ = fVar200;
  auVar72._0_4_ = fVar200;
  auVar72._8_4_ = fVar200;
  auVar72._12_4_ = fVar200;
  auVar64 = vminps_avx512vl(auVar64,auVar72);
  auVar65 = vminps_avx(auVar65,auVar64);
  auVar13._8_4_ = 0x3f800003;
  auVar13._0_8_ = 0x3f8000033f800003;
  auVar13._12_4_ = 0x3f800003;
  auVar65 = vmulps_avx512vl(auVar65,auVar13);
  auVar64 = vpbroadcastd_avx512vl();
  uVar14 = vcmpps_avx512vl(local_2b0,auVar65,2);
  local_590 = vpcmpgtd_avx512vl(auVar64,_DAT_01ff0cf0);
  local_590 = ((byte)uVar14 & 0xf) & local_590;
  bVar56 = (char)local_590 == '\0';
  bVar58 = !bVar56;
  local_598 = prim;
  if (bVar56) {
    return bVar58;
  }
LAB_01b81f4d:
  lVar54 = 0;
  for (uVar59 = local_590; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar54 = lVar54 + 1;
  }
  local_868 = (ulong)*(uint *)(prim + 2);
  local_870 = (ulong)*(uint *)(prim + lVar54 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_868].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_870);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar54 = *(long *)&pGVar4[1].time_range.upper;
  auVar65 = *(undefined1 (*) [16])(lVar54 + (long)p_Var5 * uVar59);
  auVar64 = *(undefined1 (*) [16])(lVar54 + (uVar59 + 1) * (long)p_Var5);
  auVar68 = *(undefined1 (*) [16])(lVar54 + (uVar59 + 2) * (long)p_Var5);
  local_590 = local_590 - 1 & local_590;
  auVar69 = *(undefined1 (*) [16])(lVar54 + (uVar59 + 3) * (long)p_Var5);
  if (local_590 != 0) {
    uVar52 = local_590 - 1 & local_590;
    for (uVar59 = local_590; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    }
    if (uVar52 != 0) {
      for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar195._0_4_ = auVar65._0_4_ + auVar64._0_4_ + auVar68._0_4_ + auVar69._0_4_;
  auVar195._4_4_ = auVar65._4_4_ + auVar64._4_4_ + auVar68._4_4_ + auVar69._4_4_;
  auVar195._8_4_ = auVar65._8_4_ + auVar64._8_4_ + auVar68._8_4_ + auVar69._8_4_;
  auVar195._12_4_ = auVar65._12_4_ + auVar64._12_4_ + auVar68._12_4_ + auVar69._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar18._8_4_ = 0x3e800000;
  auVar18._0_8_ = 0x3e8000003e800000;
  auVar18._12_4_ = 0x3e800000;
  auVar66 = vmulps_avx512vl(auVar195,auVar18);
  auVar66 = vsubps_avx(auVar66,(undefined1  [16])aVar1);
  auVar66 = vdpps_avx(auVar66,(undefined1  [16])aVar2,0x7f);
  auVar70 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar220._4_12_ = ZEXT812(0) << 0x20;
  auVar220._0_4_ = auVar70._0_4_;
  auVar67 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar220);
  auVar70 = vfnmadd213ss_fma(auVar67,auVar70,ZEXT416(0x40000000));
  fVar200 = auVar66._0_4_ * auVar67._0_4_ * auVar70._0_4_;
  local_4e0 = ZEXT416((uint)fVar200);
  auVar196._4_4_ = fVar200;
  auVar196._0_4_ = fVar200;
  auVar196._8_4_ = fVar200;
  auVar196._12_4_ = fVar200;
  fStack_570 = fVar200;
  _local_580 = auVar196;
  fStack_56c = fVar200;
  fStack_568 = fVar200;
  fStack_564 = fVar200;
  auVar66 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar196);
  auVar66 = vblendps_avx(auVar66,ZEXT816(0) << 0x40,8);
  auVar65 = vsubps_avx(auVar65,auVar66);
  auVar68 = vsubps_avx(auVar68,auVar66);
  uVar199 = *(undefined4 *)&(ray->dir).field_0;
  local_3a0._4_4_ = uVar199;
  local_3a0._0_4_ = uVar199;
  local_3a0._8_4_ = uVar199;
  local_3a0._12_4_ = uVar199;
  local_3a0._16_4_ = uVar199;
  local_3a0._20_4_ = uVar199;
  local_3a0._24_4_ = uVar199;
  local_3a0._28_4_ = uVar199;
  uVar199 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_340._4_4_ = uVar199;
  local_340._0_4_ = uVar199;
  local_340._8_4_ = uVar199;
  local_340._12_4_ = uVar199;
  local_340._16_4_ = uVar199;
  local_340._20_4_ = uVar199;
  local_340._24_4_ = uVar199;
  local_340._28_4_ = uVar199;
  local_360 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  auVar64 = vsubps_avx(auVar64,auVar66);
  auVar69 = vsubps_avx(auVar69,auVar66);
  uVar199 = auVar65._0_4_;
  local_1c0._4_4_ = uVar199;
  local_1c0._0_4_ = uVar199;
  local_1c0._8_4_ = uVar199;
  local_1c0._12_4_ = uVar199;
  local_1c0._16_4_ = uVar199;
  local_1c0._20_4_ = uVar199;
  local_1c0._24_4_ = uVar199;
  local_1c0._28_4_ = uVar199;
  auVar73._8_4_ = 1;
  auVar73._0_8_ = 0x100000001;
  auVar73._12_4_ = 1;
  auVar73._16_4_ = 1;
  auVar73._20_4_ = 1;
  auVar73._24_4_ = 1;
  auVar73._28_4_ = 1;
  local_400 = ZEXT1632(auVar65);
  local_6a0 = vpermps_avx512vl(auVar73,local_400);
  auVar241 = ZEXT3264(local_6a0);
  auVar74._8_4_ = 2;
  auVar74._0_8_ = 0x200000002;
  auVar74._12_4_ = 2;
  auVar74._16_4_ = 2;
  auVar74._20_4_ = 2;
  auVar74._24_4_ = 2;
  auVar74._28_4_ = 2;
  local_6c0 = vpermps_avx2(auVar74,local_400);
  auVar234 = ZEXT3264(local_6c0);
  auVar75._8_4_ = 3;
  auVar75._0_8_ = 0x300000003;
  auVar75._12_4_ = 3;
  auVar75._16_4_ = 3;
  auVar75._20_4_ = 3;
  auVar75._24_4_ = 3;
  auVar75._28_4_ = 3;
  local_3e0 = vpermps_avx2(auVar75,local_400);
  auVar232 = ZEXT3264(local_3e0);
  uVar199 = auVar64._0_4_;
  local_480._4_4_ = uVar199;
  local_480._0_4_ = uVar199;
  local_480._8_4_ = uVar199;
  local_480._12_4_ = uVar199;
  local_480._16_4_ = uVar199;
  local_480._20_4_ = uVar199;
  local_480._24_4_ = uVar199;
  local_480._28_4_ = uVar199;
  local_440 = ZEXT1632(auVar64);
  local_720 = vpermps_avx512vl(auVar73,local_440);
  auVar250 = ZEXT3264(local_720);
  local_740 = vpermps_avx512vl(auVar74,local_440);
  auVar251 = ZEXT3264(local_740);
  local_760 = vpermps_avx512vl(auVar75,local_440);
  auVar252 = ZEXT3264(local_760);
  local_780 = vbroadcastss_avx512vl(auVar68);
  auVar242 = ZEXT3264(local_780);
  local_420 = ZEXT1632(auVar68);
  local_7a0 = vpermps_avx512vl(auVar73,local_420);
  auVar243 = ZEXT3264(local_7a0);
  local_600 = vpermps_avx512vl(auVar74,local_420);
  auVar244 = ZEXT3264(local_600);
  local_620 = vpermps_avx512vl(auVar75,local_420);
  auVar245 = ZEXT3264(local_620);
  auVar185 = ZEXT3264(local_480);
  local_640 = vbroadcastss_avx512vl(auVar69);
  auVar248 = ZEXT3264(local_640);
  _local_460 = ZEXT1632(auVar69);
  local_7c0 = vpermps_avx512vl(auVar73,_local_460);
  auVar247 = ZEXT3264(local_7c0);
  local_660 = vpermps_avx512vl(auVar74,_local_460);
  auVar246 = ZEXT3264(local_660);
  local_680 = vpermps_avx512vl(auVar75,_local_460);
  auVar249 = ZEXT3264(local_680);
  auVar88 = vpermps_avx2(auVar74,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                    CONCAT48(aVar2.z * aVar2.z,
                                                             CONCAT44(aVar2.y * aVar2.y,
                                                                      aVar2.x * aVar2.x)))));
  auVar65 = vfmadd231ps_fma(auVar88,local_340,local_340);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),local_3a0,local_3a0);
  local_1a0 = ZEXT1632(auVar65);
  auVar88._8_4_ = 0x7fffffff;
  auVar88._0_8_ = 0x7fffffff7fffffff;
  auVar88._12_4_ = 0x7fffffff;
  auVar88._16_4_ = 0x7fffffff;
  auVar88._20_4_ = 0x7fffffff;
  auVar88._24_4_ = 0x7fffffff;
  auVar88._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar65),auVar88);
  local_280 = local_680;
  local_7d8 = 1;
  local_588 = 0;
  bVar49 = 0;
  local_500 = ZEXT816(0x3f80000000000000);
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  do {
    auVar65 = vmovshdup_avx(local_500);
    fVar207 = local_500._0_4_;
    fVar200 = auVar65._0_4_ - fVar207;
    fVar117 = fVar200 * 0.04761905;
    local_820._4_4_ = fVar207;
    local_820._0_4_ = fVar207;
    fStack_818 = fVar207;
    fStack_814 = fVar207;
    register0x00001350 = fVar207;
    register0x00001354 = fVar207;
    register0x00001358 = fVar207;
    register0x0000135c = fVar207;
    local_560._4_4_ = fVar200;
    local_560._0_4_ = fVar200;
    fStack_558 = fVar200;
    fStack_554 = fVar200;
    register0x00001210 = fVar200;
    register0x00001214 = fVar200;
    register0x00001218 = fVar200;
    register0x0000121c = fVar200;
    auVar65 = vfmadd231ps_fma(_local_820,_local_560,_DAT_02020f20);
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = &DAT_3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar100._16_4_ = 0x3f800000;
    auVar100._20_4_ = 0x3f800000;
    auVar100._24_4_ = 0x3f800000;
    auVar100._28_4_ = 0x3f800000;
    auVar88 = vsubps_avx(auVar100,ZEXT1632(auVar65));
    fVar200 = auVar65._0_4_;
    auVar89._0_4_ = auVar185._0_4_ * fVar200;
    fVar207 = auVar65._4_4_;
    auVar89._4_4_ = auVar185._4_4_ * fVar207;
    fVar208 = auVar65._8_4_;
    auVar89._8_4_ = auVar185._8_4_ * fVar208;
    fVar209 = auVar65._12_4_;
    auVar89._12_4_ = auVar185._12_4_ * fVar209;
    auVar89._16_4_ = auVar185._16_4_ * 0.0;
    auVar89._20_4_ = auVar185._20_4_ * 0.0;
    auVar89._24_4_ = auVar185._24_4_ * 0.0;
    auVar89._28_4_ = 0;
    auVar76 = ZEXT1632(auVar65);
    auVar73 = vmulps_avx512vl(auVar250._0_32_,auVar76);
    auVar74 = vmulps_avx512vl(auVar251._0_32_,auVar76);
    auVar75 = vmulps_avx512vl(auVar252._0_32_,auVar76);
    auVar64 = vfmadd231ps_fma(auVar89,auVar88,local_1c0);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar88,auVar241._0_32_);
    auVar68 = vfmadd231ps_fma(auVar74,auVar88,auVar234._0_32_);
    auVar69 = vfmadd231ps_fma(auVar75,auVar88,auVar232._0_32_);
    auVar74 = vmulps_avx512vl(auVar242._0_32_,auVar76);
    auVar81 = ZEXT1632(auVar65);
    auVar75 = vmulps_avx512vl(auVar243._0_32_,auVar81);
    auVar76 = vmulps_avx512vl(auVar244._0_32_,auVar81);
    auVar77 = vmulps_avx512vl(auVar245._0_32_,auVar81);
    auVar66 = vfmadd231ps_fma(auVar74,auVar88,auVar185._0_32_);
    auVar74 = vfmadd231ps_avx512vl(auVar75,auVar88,auVar250._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar251._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar252._0_32_);
    auVar77 = vmulps_avx512vl(auVar248._0_32_,auVar81);
    auVar78 = vmulps_avx512vl(auVar247._0_32_,auVar81);
    auVar79 = vmulps_avx512vl(auVar246._0_32_,auVar81);
    auVar80 = vmulps_avx512vl(auVar249._0_32_,auVar81);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar242._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar243._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar88,auVar244._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar88,auVar245._0_32_);
    auVar81 = vmulps_avx512vl(auVar81,ZEXT1632(auVar66));
    auVar94 = ZEXT1632(auVar65);
    auVar82 = vmulps_avx512vl(auVar94,auVar74);
    auVar83 = vmulps_avx512vl(auVar94,auVar75);
    auVar84 = vmulps_avx512vl(auVar94,auVar76);
    auVar85 = vfmadd231ps_avx512vl(auVar81,auVar88,ZEXT1632(auVar64));
    auVar86 = vfmadd231ps_avx512vl(auVar82,auVar88,auVar73);
    auVar87 = vfmadd231ps_avx512vl(auVar83,auVar88,ZEXT1632(auVar68));
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,ZEXT1632(auVar69));
    auVar90._0_4_ = auVar77._0_4_ * fVar200;
    auVar90._4_4_ = auVar77._4_4_ * fVar207;
    auVar90._8_4_ = auVar77._8_4_ * fVar208;
    auVar90._12_4_ = auVar77._12_4_ * fVar209;
    auVar90._16_4_ = auVar77._16_4_ * 0.0;
    auVar90._20_4_ = auVar77._20_4_ * 0.0;
    auVar90._24_4_ = auVar77._24_4_ * 0.0;
    auVar90._28_4_ = 0;
    auVar81._4_4_ = auVar78._4_4_ * fVar207;
    auVar81._0_4_ = auVar78._0_4_ * fVar200;
    auVar81._8_4_ = auVar78._8_4_ * fVar208;
    auVar81._12_4_ = auVar78._12_4_ * fVar209;
    auVar81._16_4_ = auVar78._16_4_ * 0.0;
    auVar81._20_4_ = auVar78._20_4_ * 0.0;
    auVar81._24_4_ = auVar78._24_4_ * 0.0;
    auVar81._28_4_ = auVar77._28_4_;
    auVar82._4_4_ = auVar79._4_4_ * fVar207;
    auVar82._0_4_ = auVar79._0_4_ * fVar200;
    auVar82._8_4_ = auVar79._8_4_ * fVar208;
    auVar82._12_4_ = auVar79._12_4_ * fVar209;
    auVar82._16_4_ = auVar79._16_4_ * 0.0;
    auVar82._20_4_ = auVar79._20_4_ * 0.0;
    auVar82._24_4_ = auVar79._24_4_ * 0.0;
    auVar82._28_4_ = auVar78._28_4_;
    auVar77 = vmulps_avx512vl(auVar94,auVar80);
    auVar65 = vfmadd231ps_fma(auVar90,auVar88,ZEXT1632(auVar66));
    auVar64 = vfmadd231ps_fma(auVar81,auVar88,auVar74);
    auVar68 = vfmadd231ps_fma(auVar82,auVar88,auVar75);
    auVar69 = vfmadd231ps_fma(auVar77,auVar88,auVar76);
    auVar83._28_4_ = auVar73._28_4_;
    auVar83._0_28_ =
         ZEXT1628(CONCAT412(auVar64._12_4_ * fVar209,
                            CONCAT48(auVar64._8_4_ * fVar208,
                                     CONCAT44(auVar64._4_4_ * fVar207,auVar64._0_4_ * fVar200))));
    auVar73 = vmulps_avx512vl(auVar94,ZEXT1632(auVar68));
    auVar81 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar65._12_4_ * fVar209,
                                            CONCAT48(auVar65._8_4_ * fVar208,
                                                     CONCAT44(auVar65._4_4_ * fVar207,
                                                              auVar65._0_4_ * fVar200)))),auVar88,
                         auVar85);
    auVar82 = vfmadd231ps_avx512vl(auVar83,auVar88,auVar86);
    local_860 = vfmadd231ps_avx512vl(auVar73,auVar88,auVar87);
    auVar74 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar69._12_4_ * fVar209,
                                            CONCAT48(auVar69._8_4_ * fVar208,
                                                     CONCAT44(auVar69._4_4_ * fVar207,
                                                              auVar69._0_4_ * fVar200)))),auVar84,
                         auVar88);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar65),auVar85);
    auVar73 = vsubps_avx512vl(ZEXT1632(auVar64),auVar86);
    auVar77 = vsubps_avx512vl(ZEXT1632(auVar68),auVar87);
    auVar78 = vsubps_avx512vl(ZEXT1632(auVar69),auVar84);
    auVar84._4_4_ = fVar117 * auVar88._4_4_ * 3.0;
    auVar84._0_4_ = fVar117 * auVar88._0_4_ * 3.0;
    auVar84._8_4_ = fVar117 * auVar88._8_4_ * 3.0;
    auVar84._12_4_ = fVar117 * auVar88._12_4_ * 3.0;
    auVar84._16_4_ = fVar117 * auVar88._16_4_ * 3.0;
    auVar84._20_4_ = fVar117 * auVar88._20_4_ * 3.0;
    auVar84._24_4_ = fVar117 * auVar88._24_4_ * 3.0;
    auVar84._28_4_ = auVar75._28_4_;
    auVar85._4_4_ = auVar73._4_4_ * 3.0 * fVar117;
    auVar85._0_4_ = auVar73._0_4_ * 3.0 * fVar117;
    auVar85._8_4_ = auVar73._8_4_ * 3.0 * fVar117;
    auVar85._12_4_ = auVar73._12_4_ * 3.0 * fVar117;
    auVar85._16_4_ = auVar73._16_4_ * 3.0 * fVar117;
    auVar85._20_4_ = auVar73._20_4_ * 3.0 * fVar117;
    auVar85._24_4_ = auVar73._24_4_ * 3.0 * fVar117;
    auVar85._28_4_ = auVar76._28_4_;
    auVar101._0_4_ = auVar77._0_4_ * 3.0 * fVar117;
    auVar101._4_4_ = auVar77._4_4_ * 3.0 * fVar117;
    auVar101._8_4_ = auVar77._8_4_ * 3.0 * fVar117;
    auVar101._12_4_ = auVar77._12_4_ * 3.0 * fVar117;
    auVar101._16_4_ = auVar77._16_4_ * 3.0 * fVar117;
    auVar101._20_4_ = auVar77._20_4_ * 3.0 * fVar117;
    auVar101._24_4_ = auVar77._24_4_ * 3.0 * fVar117;
    auVar101._28_4_ = 0;
    fVar200 = auVar78._0_4_ * 3.0 * fVar117;
    fVar207 = auVar78._4_4_ * 3.0 * fVar117;
    auVar86._4_4_ = fVar207;
    auVar86._0_4_ = fVar200;
    fVar208 = auVar78._8_4_ * 3.0 * fVar117;
    auVar86._8_4_ = fVar208;
    fVar209 = auVar78._12_4_ * 3.0 * fVar117;
    auVar86._12_4_ = fVar209;
    fVar210 = auVar78._16_4_ * 3.0 * fVar117;
    auVar86._16_4_ = fVar210;
    fVar211 = auVar78._20_4_ * 3.0 * fVar117;
    auVar86._20_4_ = fVar211;
    fVar212 = auVar78._24_4_ * 3.0 * fVar117;
    auVar86._24_4_ = fVar212;
    auVar86._28_4_ = fVar117;
    auVar65 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar83 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,ZEXT1632(auVar65));
    auVar89 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,ZEXT1632(auVar65));
    auVar75 = ZEXT1632(auVar65);
    auVar90 = vpermt2ps_avx512vl(local_860,_DAT_0205fd20,auVar75);
    auVar91._0_4_ = auVar74._0_4_ + fVar200;
    auVar91._4_4_ = auVar74._4_4_ + fVar207;
    auVar91._8_4_ = auVar74._8_4_ + fVar208;
    auVar91._12_4_ = auVar74._12_4_ + fVar209;
    auVar91._16_4_ = auVar74._16_4_ + fVar210;
    auVar91._20_4_ = auVar74._20_4_ + fVar211;
    auVar91._24_4_ = auVar74._24_4_ + fVar212;
    auVar91._28_4_ = auVar74._28_4_ + fVar117;
    auVar88 = vmaxps_avx(auVar74,auVar91);
    auVar73 = vminps_avx(auVar74,auVar91);
    auVar76 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,auVar75);
    auVar91 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar75);
    auVar92 = vpermt2ps_avx512vl(auVar85,_DAT_0205fd20,auVar75);
    auVar98 = ZEXT1632(auVar65);
    auVar93 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar98);
    auVar74 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,auVar98);
    auVar77 = vsubps_avx512vl(auVar76,auVar74);
    auVar74 = vsubps_avx(auVar83,auVar81);
    auVar75 = vsubps_avx(auVar89,auVar82);
    auVar86 = vsubps_avx512vl(auVar90,local_860);
    auVar78 = vmulps_avx512vl(auVar75,auVar101);
    auVar78 = vfmsub231ps_avx512vl(auVar78,auVar85,auVar86);
    auVar79 = vmulps_avx512vl(auVar86,auVar84);
    auVar79 = vfmsub231ps_avx512vl(auVar79,auVar101,auVar74);
    auVar80 = vmulps_avx512vl(auVar74,auVar85);
    auVar80 = vfmsub231ps_avx512vl(auVar80,auVar84,auVar75);
    auVar80 = vmulps_avx512vl(auVar80,auVar80);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar79,auVar79);
    auVar78 = vfmadd231ps_avx512vl(auVar79,auVar78,auVar78);
    auVar79 = vmulps_avx512vl(auVar86,auVar86);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar75,auVar75);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar74);
    auVar80 = vrcp14ps_avx512vl(auVar79);
    auVar87 = vfnmadd213ps_avx512vl(auVar80,auVar79,auVar100);
    auVar80 = vfmadd132ps_avx512vl(auVar87,auVar80,auVar80);
    auVar78 = vmulps_avx512vl(auVar78,auVar80);
    auVar87 = vmulps_avx512vl(auVar75,auVar93);
    auVar87 = vfmsub231ps_avx512vl(auVar87,auVar92,auVar86);
    auVar94 = vmulps_avx512vl(auVar86,auVar91);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar93,auVar74);
    auVar95 = vmulps_avx512vl(auVar74,auVar92);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar91,auVar75);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar87 = vfmadd231ps_avx512vl(auVar94,auVar87,auVar87);
    auVar80 = vmulps_avx512vl(auVar87,auVar80);
    auVar78 = vmaxps_avx512vl(auVar78,auVar80);
    auVar78 = vsqrtps_avx512vl(auVar78);
    auVar80 = vmaxps_avx512vl(auVar77,auVar76);
    auVar88 = vmaxps_avx512vl(auVar88,auVar80);
    auVar88 = vaddps_avx512vl(auVar78,auVar88);
    auVar76 = vminps_avx512vl(auVar77,auVar76);
    auVar73 = vminps_avx512vl(auVar73,auVar76);
    auVar73 = vsubps_avx512vl(auVar73,auVar78);
    auVar76._8_4_ = 0x3f800002;
    auVar76._0_8_ = 0x3f8000023f800002;
    auVar76._12_4_ = 0x3f800002;
    auVar76._16_4_ = 0x3f800002;
    auVar76._20_4_ = 0x3f800002;
    auVar76._24_4_ = 0x3f800002;
    auVar76._28_4_ = 0x3f800002;
    auVar88 = vmulps_avx512vl(auVar88,auVar76);
    auVar77._8_4_ = 0x3f7ffffc;
    auVar77._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar77._12_4_ = 0x3f7ffffc;
    auVar77._16_4_ = 0x3f7ffffc;
    auVar77._20_4_ = 0x3f7ffffc;
    auVar77._24_4_ = 0x3f7ffffc;
    auVar77._28_4_ = 0x3f7ffffc;
    local_520 = vmulps_avx512vl(auVar73,auVar77);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    auVar73 = vrsqrt14ps_avx512vl(auVar79);
    auVar78._8_4_ = 0xbf000000;
    auVar78._0_8_ = 0xbf000000bf000000;
    auVar78._12_4_ = 0xbf000000;
    auVar78._16_4_ = 0xbf000000;
    auVar78._20_4_ = 0xbf000000;
    auVar78._24_4_ = 0xbf000000;
    auVar78._28_4_ = 0xbf000000;
    auVar76 = vmulps_avx512vl(auVar79,auVar78);
    auVar87._4_4_ = auVar73._4_4_ * auVar76._4_4_;
    auVar87._0_4_ = auVar73._0_4_ * auVar76._0_4_;
    auVar87._8_4_ = auVar73._8_4_ * auVar76._8_4_;
    auVar87._12_4_ = auVar73._12_4_ * auVar76._12_4_;
    auVar87._16_4_ = auVar73._16_4_ * auVar76._16_4_;
    auVar87._20_4_ = auVar73._20_4_ * auVar76._20_4_;
    auVar87._24_4_ = auVar73._24_4_ * auVar76._24_4_;
    auVar87._28_4_ = auVar76._28_4_;
    auVar76 = vmulps_avx512vl(auVar73,auVar73);
    auVar76 = vmulps_avx512vl(auVar76,auVar87);
    auVar79._8_4_ = 0x3fc00000;
    auVar79._0_8_ = 0x3fc000003fc00000;
    auVar79._12_4_ = 0x3fc00000;
    auVar79._16_4_ = 0x3fc00000;
    auVar79._20_4_ = 0x3fc00000;
    auVar79._24_4_ = 0x3fc00000;
    auVar79._28_4_ = 0x3fc00000;
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar73,auVar79);
    auVar94._4_4_ = auVar76._4_4_ * auVar74._4_4_;
    auVar94._0_4_ = auVar76._0_4_ * auVar74._0_4_;
    auVar94._8_4_ = auVar76._8_4_ * auVar74._8_4_;
    auVar94._12_4_ = auVar76._12_4_ * auVar74._12_4_;
    auVar94._16_4_ = auVar76._16_4_ * auVar74._16_4_;
    auVar94._20_4_ = auVar76._20_4_ * auVar74._20_4_;
    auVar94._24_4_ = auVar76._24_4_ * auVar74._24_4_;
    auVar94._28_4_ = auVar73._28_4_;
    auVar73 = vmulps_avx512vl(auVar75,auVar76);
    auVar77 = vmulps_avx512vl(auVar86,auVar76);
    auVar78 = vsubps_avx512vl(auVar98,auVar81);
    auVar79 = vsubps_avx512vl(auVar98,auVar82);
    auVar87 = vsubps_avx512vl(auVar98,local_860);
    auVar95._4_4_ = uStack_35c;
    auVar95._0_4_ = local_360;
    auVar95._8_4_ = uStack_358;
    auVar95._12_4_ = uStack_354;
    auVar95._16_4_ = uStack_350;
    auVar95._20_4_ = uStack_34c;
    auVar95._24_4_ = uStack_348;
    auVar95._28_4_ = uStack_344;
    auVar80 = vmulps_avx512vl(auVar95,auVar87);
    auVar80 = vfmadd231ps_avx512vl(auVar80,local_340,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar80,local_3a0,auVar78);
    auVar96 = vmulps_avx512vl(auVar87,auVar87);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar79,auVar79);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar78,auVar78);
    auVar95 = vmulps_avx512vl(auVar95,auVar77);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar73,local_340);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,local_3a0);
    auVar77 = vmulps_avx512vl(auVar87,auVar77);
    auVar73 = vfmadd231ps_avx512vl(auVar77,auVar79,auVar73);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar94);
    local_540 = vmulps_avx512vl(auVar95,auVar95);
    auVar77 = vsubps_avx512vl(local_1a0,local_540);
    auVar94 = vmulps_avx512vl(auVar95,auVar73);
    auVar80 = vsubps_avx512vl(auVar80,auVar94);
    auVar94 = vaddps_avx512vl(auVar80,auVar80);
    auVar80 = vmulps_avx512vl(auVar73,auVar73);
    local_840 = vsubps_avx512vl(auVar96,auVar80);
    auVar88 = vsubps_avx512vl(local_840,auVar88);
    auVar96 = vmulps_avx512vl(auVar94,auVar94);
    auVar80._8_4_ = 0x40800000;
    auVar80._0_8_ = 0x4080000040800000;
    auVar80._12_4_ = 0x40800000;
    auVar80._16_4_ = 0x40800000;
    auVar80._20_4_ = 0x40800000;
    auVar80._24_4_ = 0x40800000;
    auVar80._28_4_ = 0x40800000;
    auVar80 = vmulps_avx512vl(auVar77,auVar80);
    auVar97 = vmulps_avx512vl(auVar80,auVar88);
    auVar97 = vsubps_avx512vl(auVar96,auVar97);
    uVar59 = vcmpps_avx512vl(auVar97,auVar98,5);
    bVar51 = (byte)uVar59;
    if (bVar51 == 0) {
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar97 = vsqrtps_avx512vl(auVar97);
      auVar98 = vaddps_avx512vl(auVar77,auVar77);
      auVar99 = vrcp14ps_avx512vl(auVar98);
      auVar100 = vfnmadd213ps_avx512vl(auVar98,auVar99,auVar100);
      auVar100 = vfmadd132ps_avx512vl(auVar100,auVar99,auVar99);
      auVar99._8_4_ = 0x80000000;
      auVar99._0_8_ = 0x8000000080000000;
      auVar99._12_4_ = 0x80000000;
      auVar99._16_4_ = 0x80000000;
      auVar99._20_4_ = 0x80000000;
      auVar99._24_4_ = 0x80000000;
      auVar99._28_4_ = 0x80000000;
      auVar98 = vxorps_avx512vl(auVar94,auVar99);
      auVar98 = vsubps_avx512vl(auVar98,auVar97);
      auVar98 = vmulps_avx512vl(auVar98,auVar100);
      auVar97 = vsubps_avx512vl(auVar97,auVar94);
      auVar100 = vmulps_avx512vl(auVar97,auVar100);
      auVar97 = vfmadd213ps_avx512vl(auVar95,auVar98,auVar73);
      local_2e0 = vmulps_avx512vl(auVar76,auVar97);
      auVar97 = vfmadd213ps_avx512vl(auVar95,auVar100,auVar73);
      local_300 = vmulps_avx512vl(auVar76,auVar97);
      auVar126._8_4_ = 0x7f800000;
      auVar126._0_8_ = 0x7f8000007f800000;
      auVar126._12_4_ = 0x7f800000;
      auVar126._16_4_ = 0x7f800000;
      auVar126._20_4_ = 0x7f800000;
      auVar126._24_4_ = 0x7f800000;
      auVar126._28_4_ = 0x7f800000;
      auVar97 = vblendmps_avx512vl(auVar126,auVar98);
      auVar98._0_4_ =
           (uint)(bVar51 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar51 & 1) * local_300._0_4_;
      bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar98._4_4_ = (uint)bVar56 * auVar97._4_4_ | (uint)!bVar56 * local_300._4_4_;
      bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar98._8_4_ = (uint)bVar56 * auVar97._8_4_ | (uint)!bVar56 * local_300._8_4_;
      bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar98._12_4_ = (uint)bVar56 * auVar97._12_4_ | (uint)!bVar56 * local_300._12_4_;
      bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar98._16_4_ = (uint)bVar56 * auVar97._16_4_ | (uint)!bVar56 * local_300._16_4_;
      bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar98._20_4_ = (uint)bVar56 * auVar97._20_4_ | (uint)!bVar56 * local_300._20_4_;
      bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar98._24_4_ = (uint)bVar56 * auVar97._24_4_ | (uint)!bVar56 * local_300._24_4_;
      bVar56 = SUB81(uVar59 >> 7,0);
      auVar98._28_4_ = (uint)bVar56 * auVar97._28_4_ | (uint)!bVar56 * local_300._28_4_;
      auVar127._8_4_ = 0xff800000;
      auVar127._0_8_ = 0xff800000ff800000;
      auVar127._12_4_ = 0xff800000;
      auVar127._16_4_ = 0xff800000;
      auVar127._20_4_ = 0xff800000;
      auVar127._24_4_ = 0xff800000;
      auVar127._28_4_ = 0xff800000;
      auVar99 = vblendmps_avx512vl(auVar127,auVar100);
      auVar97._0_4_ =
           (uint)(bVar51 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar100._0_4_;
      bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar97._4_4_ = (uint)bVar56 * auVar99._4_4_ | (uint)!bVar56 * auVar100._4_4_;
      bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar97._8_4_ = (uint)bVar56 * auVar99._8_4_ | (uint)!bVar56 * auVar100._8_4_;
      bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar97._12_4_ = (uint)bVar56 * auVar99._12_4_ | (uint)!bVar56 * auVar100._12_4_;
      bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar97._16_4_ = (uint)bVar56 * auVar99._16_4_ | (uint)!bVar56 * auVar100._16_4_;
      bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar97._20_4_ = (uint)bVar56 * auVar99._20_4_ | (uint)!bVar56 * auVar100._20_4_;
      bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar97._24_4_ = (uint)bVar56 * auVar99._24_4_ | (uint)!bVar56 * auVar100._24_4_;
      bVar56 = SUB81(uVar59 >> 7,0);
      auVar97._28_4_ = (uint)bVar56 * auVar99._28_4_ | (uint)!bVar56 * auVar100._28_4_;
      auVar128._8_4_ = 0x7fffffff;
      auVar128._0_8_ = 0x7fffffff7fffffff;
      auVar128._12_4_ = 0x7fffffff;
      auVar128._16_4_ = 0x7fffffff;
      auVar128._20_4_ = 0x7fffffff;
      auVar128._24_4_ = 0x7fffffff;
      auVar128._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_540,auVar128);
      auVar100 = vmaxps_avx512vl(local_280,local_540);
      auVar102._8_4_ = 0x36000000;
      auVar102._0_8_ = 0x3600000036000000;
      auVar102._12_4_ = 0x36000000;
      auVar102._16_4_ = 0x36000000;
      auVar102._20_4_ = 0x36000000;
      auVar102._24_4_ = 0x36000000;
      auVar102._28_4_ = 0x36000000;
      auVar99 = vmulps_avx512vl(auVar100,auVar102);
      auVar100 = vandps_avx(auVar77,auVar128);
      uVar52 = vcmpps_avx512vl(auVar100,auVar99,1);
      uVar59 = uVar59 & uVar52;
      bVar53 = (byte)uVar59;
      if (bVar53 != 0) {
        uVar52 = vcmpps_avx512vl(auVar88,_DAT_02020f00,2);
        auVar154._8_4_ = 0xff800000;
        auVar154._0_8_ = 0xff800000ff800000;
        auVar154._12_4_ = 0xff800000;
        auVar154._16_4_ = 0xff800000;
        auVar154._20_4_ = 0xff800000;
        auVar154._24_4_ = 0xff800000;
        auVar154._28_4_ = 0xff800000;
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar99 = vblendmps_avx512vl(auVar88,auVar154);
        bVar50 = (byte)uVar52;
        uVar60 = (uint)(bVar50 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar100._0_4_;
        bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
        uVar110 = (uint)bVar56 * auVar99._4_4_ | (uint)!bVar56 * auVar100._4_4_;
        bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
        uVar111 = (uint)bVar56 * auVar99._8_4_ | (uint)!bVar56 * auVar100._8_4_;
        bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
        uVar112 = (uint)bVar56 * auVar99._12_4_ | (uint)!bVar56 * auVar100._12_4_;
        bVar56 = (bool)((byte)(uVar52 >> 4) & 1);
        uVar113 = (uint)bVar56 * auVar99._16_4_ | (uint)!bVar56 * auVar100._16_4_;
        bVar56 = (bool)((byte)(uVar52 >> 5) & 1);
        uVar114 = (uint)bVar56 * auVar99._20_4_ | (uint)!bVar56 * auVar100._20_4_;
        bVar56 = (bool)((byte)(uVar52 >> 6) & 1);
        uVar115 = (uint)bVar56 * auVar99._24_4_ | (uint)!bVar56 * auVar100._24_4_;
        bVar56 = SUB81(uVar52 >> 7,0);
        uVar116 = (uint)bVar56 * auVar99._28_4_ | (uint)!bVar56 * auVar100._28_4_;
        auVar98._0_4_ = (bVar53 & 1) * uVar60 | !(bool)(bVar53 & 1) * auVar98._0_4_;
        bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar98._4_4_ = bVar56 * uVar110 | !bVar56 * auVar98._4_4_;
        bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar98._8_4_ = bVar56 * uVar111 | !bVar56 * auVar98._8_4_;
        bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar98._12_4_ = bVar56 * uVar112 | !bVar56 * auVar98._12_4_;
        bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar98._16_4_ = bVar56 * uVar113 | !bVar56 * auVar98._16_4_;
        bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar98._20_4_ = bVar56 * uVar114 | !bVar56 * auVar98._20_4_;
        bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar98._24_4_ = bVar56 * uVar115 | !bVar56 * auVar98._24_4_;
        bVar56 = SUB81(uVar59 >> 7,0);
        auVar98._28_4_ = bVar56 * uVar116 | !bVar56 * auVar98._28_4_;
        auVar88 = vblendmps_avx512vl(auVar154,auVar88);
        bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar52 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar52 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar52 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar52 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar52 >> 6) & 1);
        bVar12 = SUB81(uVar52 >> 7,0);
        auVar97._0_4_ =
             (uint)(bVar53 & 1) *
             ((uint)(bVar50 & 1) * auVar88._0_4_ | !(bool)(bVar50 & 1) * uVar60) |
             !(bool)(bVar53 & 1) * auVar97._0_4_;
        bVar6 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar97._4_4_ =
             (uint)bVar6 * ((uint)bVar56 * auVar88._4_4_ | !bVar56 * uVar110) |
             !bVar6 * auVar97._4_4_;
        bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar97._8_4_ =
             (uint)bVar56 * ((uint)bVar7 * auVar88._8_4_ | !bVar7 * uVar111) |
             !bVar56 * auVar97._8_4_;
        bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar97._12_4_ =
             (uint)bVar56 * ((uint)bVar8 * auVar88._12_4_ | !bVar8 * uVar112) |
             !bVar56 * auVar97._12_4_;
        bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar97._16_4_ =
             (uint)bVar56 * ((uint)bVar9 * auVar88._16_4_ | !bVar9 * uVar113) |
             !bVar56 * auVar97._16_4_;
        bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar97._20_4_ =
             (uint)bVar56 * ((uint)bVar10 * auVar88._20_4_ | !bVar10 * uVar114) |
             !bVar56 * auVar97._20_4_;
        bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar97._24_4_ =
             (uint)bVar56 * ((uint)bVar11 * auVar88._24_4_ | !bVar11 * uVar115) |
             !bVar56 * auVar97._24_4_;
        bVar56 = SUB81(uVar59 >> 7,0);
        auVar97._28_4_ =
             (uint)bVar56 * ((uint)bVar12 * auVar88._28_4_ | !bVar12 * uVar116) |
             !bVar56 * auVar97._28_4_;
        bVar51 = (~bVar53 | bVar50) & bVar51;
      }
    }
    in_ZMM31 = ZEXT3264(auVar98);
    fVar200 = (float)local_580._0_4_;
    fVar207 = (float)local_580._4_4_;
    fVar208 = fStack_578;
    fVar209 = fStack_574;
    fVar117 = fStack_570;
    fVar210 = fStack_56c;
    fVar211 = fStack_568;
    fVar212 = fStack_564;
    if ((bVar51 & 0x7f) == 0) {
LAB_01b82b9a:
      auVar241 = ZEXT3264(local_6a0);
      auVar234 = ZEXT3264(local_6c0);
      auVar232 = ZEXT3264(local_3e0);
      auVar185 = ZEXT3264(local_480);
      auVar250 = ZEXT3264(local_720);
      auVar251 = ZEXT3264(local_740);
      auVar252 = ZEXT3264(local_760);
      auVar242 = ZEXT3264(local_780);
      auVar243 = ZEXT3264(local_7a0);
      auVar244 = ZEXT3264(local_600);
      auVar245 = ZEXT3264(local_620);
      auVar248 = ZEXT3264(local_640);
      auVar247 = ZEXT3264(local_7c0);
      auVar246 = ZEXT3264(local_660);
      auVar249 = ZEXT3264(local_680);
    }
    else {
      auVar65 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4e0);
      auVar129._0_4_ = auVar65._0_4_;
      auVar129._4_4_ = auVar129._0_4_;
      auVar129._8_4_ = auVar129._0_4_;
      auVar129._12_4_ = auVar129._0_4_;
      auVar129._16_4_ = auVar129._0_4_;
      auVar129._20_4_ = auVar129._0_4_;
      auVar129._24_4_ = auVar129._0_4_;
      auVar129._28_4_ = auVar129._0_4_;
      auVar88 = vmaxps_avx512vl(auVar129,auVar98);
      auVar65 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4e0);
      auVar150._0_4_ = auVar65._0_4_;
      auVar150._4_4_ = auVar150._0_4_;
      auVar150._8_4_ = auVar150._0_4_;
      auVar150._12_4_ = auVar150._0_4_;
      auVar150._16_4_ = auVar150._0_4_;
      auVar150._20_4_ = auVar150._0_4_;
      auVar150._24_4_ = auVar150._0_4_;
      auVar150._28_4_ = auVar150._0_4_;
      auVar97 = vminps_avx512vl(auVar150,auVar97);
      auVar87 = vmulps_avx512vl(auVar87,auVar101);
      auVar79 = vfmadd213ps_avx512vl(auVar79,auVar85,auVar87);
      auVar78 = vfmadd213ps_avx512vl(auVar78,auVar84,auVar79);
      auVar43._4_4_ = uStack_35c;
      auVar43._0_4_ = local_360;
      auVar43._8_4_ = uStack_358;
      auVar43._12_4_ = uStack_354;
      auVar43._16_4_ = uStack_350;
      auVar43._20_4_ = uStack_34c;
      auVar43._24_4_ = uStack_348;
      auVar43._28_4_ = uStack_344;
      auVar79 = vmulps_avx512vl(auVar43,auVar101);
      auVar79 = vfmadd231ps_avx512vl(auVar79,local_340,auVar85);
      auVar79 = vfmadd231ps_avx512vl(auVar79,local_3a0,auVar84);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar79,auVar85);
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar85,auVar87,1);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar100);
      auVar78 = vxorps_avx512vl(auVar78,auVar100);
      auVar84 = vrcp14ps_avx512vl(auVar79);
      auVar101 = vxorps_avx512vl(auVar79,auVar100);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar99 = vfnmadd213ps_avx512vl(auVar84,auVar79,auVar98);
      auVar99 = vfmadd132ps_avx512vl(auVar99,auVar84,auVar84);
      auVar78 = vmulps_avx512vl(auVar99,auVar78);
      uVar15 = vcmpps_avx512vl(auVar79,auVar101,1);
      bVar53 = (byte)uVar14 | (byte)uVar15;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar78,auVar99);
      auVar103._0_4_ =
           (uint)(bVar53 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar84._0_4_;
      bVar56 = (bool)(bVar53 >> 1 & 1);
      auVar103._4_4_ = (uint)bVar56 * auVar102._4_4_ | (uint)!bVar56 * auVar84._4_4_;
      bVar56 = (bool)(bVar53 >> 2 & 1);
      auVar103._8_4_ = (uint)bVar56 * auVar102._8_4_ | (uint)!bVar56 * auVar84._8_4_;
      bVar56 = (bool)(bVar53 >> 3 & 1);
      auVar103._12_4_ = (uint)bVar56 * auVar102._12_4_ | (uint)!bVar56 * auVar84._12_4_;
      bVar56 = (bool)(bVar53 >> 4 & 1);
      auVar103._16_4_ = (uint)bVar56 * auVar102._16_4_ | (uint)!bVar56 * auVar84._16_4_;
      bVar56 = (bool)(bVar53 >> 5 & 1);
      auVar103._20_4_ = (uint)bVar56 * auVar102._20_4_ | (uint)!bVar56 * auVar84._20_4_;
      bVar56 = (bool)(bVar53 >> 6 & 1);
      auVar103._24_4_ = (uint)bVar56 * auVar102._24_4_ | (uint)!bVar56 * auVar84._24_4_;
      auVar103._28_4_ =
           (uint)(bVar53 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar84._28_4_;
      auVar88 = vmaxps_avx(auVar88,auVar103);
      uVar15 = vcmpps_avx512vl(auVar79,auVar101,6);
      bVar53 = (byte)uVar14 | (byte)uVar15;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar104._0_4_ =
           (uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar78._0_4_;
      bVar56 = (bool)(bVar53 >> 1 & 1);
      auVar104._4_4_ = (uint)bVar56 * auVar101._4_4_ | (uint)!bVar56 * auVar78._4_4_;
      bVar56 = (bool)(bVar53 >> 2 & 1);
      auVar104._8_4_ = (uint)bVar56 * auVar101._8_4_ | (uint)!bVar56 * auVar78._8_4_;
      bVar56 = (bool)(bVar53 >> 3 & 1);
      auVar104._12_4_ = (uint)bVar56 * auVar101._12_4_ | (uint)!bVar56 * auVar78._12_4_;
      bVar56 = (bool)(bVar53 >> 4 & 1);
      auVar104._16_4_ = (uint)bVar56 * auVar101._16_4_ | (uint)!bVar56 * auVar78._16_4_;
      bVar56 = (bool)(bVar53 >> 5 & 1);
      auVar104._20_4_ = (uint)bVar56 * auVar101._20_4_ | (uint)!bVar56 * auVar78._20_4_;
      bVar56 = (bool)(bVar53 >> 6 & 1);
      auVar104._24_4_ = (uint)bVar56 * auVar101._24_4_ | (uint)!bVar56 * auVar78._24_4_;
      auVar104._28_4_ =
           (uint)(bVar53 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar78._28_4_;
      auVar78 = vminps_avx(auVar97,auVar104);
      auVar79 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
      auVar83 = vsubps_avx(ZEXT832(0) << 0x20,auVar89);
      auVar89 = ZEXT832(0) << 0x20;
      auVar84 = vsubps_avx(auVar89,auVar90);
      auVar33._4_4_ = auVar84._4_4_ * auVar93._4_4_;
      auVar33._0_4_ = auVar84._0_4_ * auVar93._0_4_;
      auVar33._8_4_ = auVar84._8_4_ * auVar93._8_4_;
      auVar33._12_4_ = auVar84._12_4_ * auVar93._12_4_;
      auVar33._16_4_ = auVar84._16_4_ * auVar93._16_4_;
      auVar33._20_4_ = auVar84._20_4_ * auVar93._20_4_;
      auVar33._24_4_ = auVar84._24_4_ * auVar93._24_4_;
      auVar33._28_4_ = auVar84._28_4_;
      auVar83 = vfnmsub231ps_avx512vl(auVar33,auVar92,auVar83);
      auVar79 = vfnmadd231ps_avx512vl(auVar83,auVar91,auVar79);
      auVar83 = vmulps_avx512vl(auVar43,auVar93);
      auVar83 = vfnmsub231ps_avx512vl(auVar83,local_340,auVar92);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,local_3a0,auVar91);
      vandps_avx512vl(auVar83,auVar85);
      uVar14 = vcmpps_avx512vl(auVar83,auVar87,1);
      auVar79 = vxorps_avx512vl(auVar79,auVar100);
      auVar84 = vrcp14ps_avx512vl(auVar83);
      auVar85 = vxorps_avx512vl(auVar83,auVar100);
      auVar87 = vfnmadd213ps_avx512vl(auVar84,auVar83,auVar98);
      auVar65 = vfmadd132ps_fma(auVar87,auVar84,auVar84);
      fVar223 = auVar65._0_4_ * auVar79._0_4_;
      fVar225 = auVar65._4_4_ * auVar79._4_4_;
      auVar93._4_4_ = fVar225;
      auVar93._0_4_ = fVar223;
      fVar226 = auVar65._8_4_ * auVar79._8_4_;
      auVar93._8_4_ = fVar226;
      fVar227 = auVar65._12_4_ * auVar79._12_4_;
      auVar93._12_4_ = fVar227;
      fVar228 = auVar79._16_4_ * 0.0;
      auVar93._16_4_ = fVar228;
      fVar229 = auVar79._20_4_ * 0.0;
      auVar93._20_4_ = fVar229;
      fVar230 = auVar79._24_4_ * 0.0;
      auVar93._24_4_ = fVar230;
      auVar93._28_4_ = auVar79._28_4_;
      uVar15 = vcmpps_avx512vl(auVar83,auVar85,1);
      bVar53 = (byte)uVar14 | (byte)uVar15;
      auVar87 = vblendmps_avx512vl(auVar93,auVar99);
      auVar105._0_4_ =
           (uint)(bVar53 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar84._0_4_;
      bVar56 = (bool)(bVar53 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar56 * auVar87._4_4_ | (uint)!bVar56 * auVar84._4_4_;
      bVar56 = (bool)(bVar53 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar56 * auVar87._8_4_ | (uint)!bVar56 * auVar84._8_4_;
      bVar56 = (bool)(bVar53 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar56 * auVar87._12_4_ | (uint)!bVar56 * auVar84._12_4_;
      bVar56 = (bool)(bVar53 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar56 * auVar87._16_4_ | (uint)!bVar56 * auVar84._16_4_;
      bVar56 = (bool)(bVar53 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar56 * auVar87._20_4_ | (uint)!bVar56 * auVar84._20_4_;
      bVar56 = (bool)(bVar53 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar56 * auVar87._24_4_ | (uint)!bVar56 * auVar84._24_4_;
      auVar105._28_4_ =
           (uint)(bVar53 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar84._28_4_;
      _local_3c0 = vmaxps_avx(auVar88,auVar105);
      uVar15 = vcmpps_avx512vl(auVar83,auVar85,6);
      bVar53 = (byte)uVar14 | (byte)uVar15;
      auVar106._0_4_ =
           (uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)fVar223;
      bVar56 = (bool)(bVar53 >> 1 & 1);
      auVar106._4_4_ = (uint)bVar56 * auVar101._4_4_ | (uint)!bVar56 * (int)fVar225;
      bVar56 = (bool)(bVar53 >> 2 & 1);
      auVar106._8_4_ = (uint)bVar56 * auVar101._8_4_ | (uint)!bVar56 * (int)fVar226;
      bVar56 = (bool)(bVar53 >> 3 & 1);
      auVar106._12_4_ = (uint)bVar56 * auVar101._12_4_ | (uint)!bVar56 * (int)fVar227;
      bVar56 = (bool)(bVar53 >> 4 & 1);
      auVar106._16_4_ = (uint)bVar56 * auVar101._16_4_ | (uint)!bVar56 * (int)fVar228;
      bVar56 = (bool)(bVar53 >> 5 & 1);
      auVar106._20_4_ = (uint)bVar56 * auVar101._20_4_ | (uint)!bVar56 * (int)fVar229;
      bVar56 = (bool)(bVar53 >> 6 & 1);
      auVar106._24_4_ = (uint)bVar56 * auVar101._24_4_ | (uint)!bVar56 * (int)fVar230;
      auVar106._28_4_ =
           (uint)(bVar53 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar79._28_4_;
      local_200 = vminps_avx(auVar78,auVar106);
      uVar14 = vcmpps_avx512vl(_local_3c0,local_200,2);
      bVar51 = bVar51 & 0x7f & (byte)uVar14;
      if (bVar51 == 0) goto LAB_01b82b9a;
      auVar88 = vmaxps_avx(auVar89,local_520);
      auVar78 = vminps_avx512vl(local_2e0,auVar98);
      auVar40 = ZEXT412(0);
      auVar79 = ZEXT1232(auVar40) << 0x20;
      auVar78 = vmaxps_avx(auVar78,ZEXT1232(auVar40) << 0x20);
      auVar83 = vminps_avx512vl(local_300,auVar98);
      auVar34._4_4_ = (auVar78._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar78._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar78._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar78._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar78._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar78._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar78._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar78._28_4_ + 7.0;
      local_2e0 = vfmadd213ps_avx512vl(auVar34,_local_560,_local_820);
      auVar78 = vmaxps_avx(auVar83,ZEXT1232(auVar40) << 0x20);
      auVar35._4_4_ = (auVar78._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar78._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar78._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar78._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar78._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar78._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar78._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar78._28_4_ + 7.0;
      local_300 = vfmadd213ps_avx512vl(auVar35,_local_560,_local_820);
      auVar36._4_4_ = auVar88._4_4_ * auVar88._4_4_;
      auVar36._0_4_ = auVar88._0_4_ * auVar88._0_4_;
      auVar36._8_4_ = auVar88._8_4_ * auVar88._8_4_;
      auVar36._12_4_ = auVar88._12_4_ * auVar88._12_4_;
      auVar36._16_4_ = auVar88._16_4_ * auVar88._16_4_;
      auVar36._20_4_ = auVar88._20_4_ * auVar88._20_4_;
      auVar36._24_4_ = auVar88._24_4_ * auVar88._24_4_;
      auVar36._28_4_ = local_300._28_4_;
      auVar88 = vsubps_avx(local_840,auVar36);
      auVar78 = vmulps_avx512vl(auVar80,auVar88);
      auVar78 = vsubps_avx512vl(auVar96,auVar78);
      uVar14 = vcmpps_avx512vl(auVar78,ZEXT1232(auVar40) << 0x20,5);
      bVar53 = (byte)uVar14;
      auVar249 = ZEXT3264(local_680);
      if (bVar53 == 0) {
        auVar73 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar185 = ZEXT864(0) << 0x20;
        auVar78 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar80 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar224 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar92._8_4_ = 0x7f800000;
        auVar92._0_8_ = 0x7f8000007f800000;
        auVar92._12_4_ = 0x7f800000;
        auVar92._16_4_ = 0x7f800000;
        auVar92._20_4_ = 0x7f800000;
        auVar92._24_4_ = 0x7f800000;
        auVar92._28_4_ = 0x7f800000;
        auVar96._8_4_ = 0xff800000;
        auVar96._0_8_ = 0xff800000ff800000;
        auVar96._12_4_ = 0xff800000;
        auVar96._16_4_ = 0xff800000;
        auVar96._20_4_ = 0xff800000;
        auVar96._24_4_ = 0xff800000;
        auVar96._28_4_ = 0xff800000;
      }
      else {
        auVar64 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
        uVar59 = vcmpps_avx512vl(auVar78,auVar89,5);
        auVar78 = vsqrtps_avx(auVar78);
        auVar151._0_4_ = auVar77._0_4_ + auVar77._0_4_;
        auVar151._4_4_ = auVar77._4_4_ + auVar77._4_4_;
        auVar151._8_4_ = auVar77._8_4_ + auVar77._8_4_;
        auVar151._12_4_ = auVar77._12_4_ + auVar77._12_4_;
        auVar151._16_4_ = auVar77._16_4_ + auVar77._16_4_;
        auVar151._20_4_ = auVar77._20_4_ + auVar77._20_4_;
        auVar151._24_4_ = auVar77._24_4_ + auVar77._24_4_;
        auVar151._28_4_ = auVar77._28_4_ + auVar77._28_4_;
        auVar79 = vrcp14ps_avx512vl(auVar151);
        auVar80 = vfnmadd213ps_avx512vl(auVar151,auVar79,auVar98);
        auVar65 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
        auVar26._8_4_ = 0x80000000;
        auVar26._0_8_ = 0x8000000080000000;
        auVar26._12_4_ = 0x80000000;
        auVar26._16_4_ = 0x80000000;
        auVar26._20_4_ = 0x80000000;
        auVar26._24_4_ = 0x80000000;
        auVar26._28_4_ = 0x80000000;
        auVar79 = vxorps_avx512vl(auVar94,auVar26);
        auVar79 = vsubps_avx(auVar79,auVar78);
        auVar37._4_4_ = auVar79._4_4_ * auVar65._4_4_;
        auVar37._0_4_ = auVar79._0_4_ * auVar65._0_4_;
        auVar37._8_4_ = auVar79._8_4_ * auVar65._8_4_;
        auVar37._12_4_ = auVar79._12_4_ * auVar65._12_4_;
        auVar37._16_4_ = auVar79._16_4_ * 0.0;
        auVar37._20_4_ = auVar79._20_4_ * 0.0;
        auVar37._24_4_ = auVar79._24_4_ * 0.0;
        auVar37._28_4_ = 0x3e000000;
        auVar78 = vsubps_avx512vl(auVar78,auVar94);
        auVar238._0_4_ = auVar78._0_4_ * auVar65._0_4_;
        auVar238._4_4_ = auVar78._4_4_ * auVar65._4_4_;
        auVar238._8_4_ = auVar78._8_4_ * auVar65._8_4_;
        auVar238._12_4_ = auVar78._12_4_ * auVar65._12_4_;
        auVar238._16_4_ = auVar78._16_4_ * 0.0;
        auVar238._20_4_ = auVar78._20_4_ * 0.0;
        auVar238._24_4_ = auVar78._24_4_ * 0.0;
        auVar238._28_4_ = 0;
        auVar78 = vfmadd213ps_avx512vl(auVar95,auVar37,auVar73);
        auVar38._4_4_ = auVar76._4_4_ * auVar78._4_4_;
        auVar38._0_4_ = auVar76._0_4_ * auVar78._0_4_;
        auVar38._8_4_ = auVar76._8_4_ * auVar78._8_4_;
        auVar38._12_4_ = auVar76._12_4_ * auVar78._12_4_;
        auVar38._16_4_ = auVar76._16_4_ * auVar78._16_4_;
        auVar38._20_4_ = auVar76._20_4_ * auVar78._20_4_;
        auVar38._24_4_ = auVar76._24_4_ * auVar78._24_4_;
        auVar38._28_4_ = auVar79._28_4_;
        auVar78 = vmulps_avx512vl(local_3a0,auVar37);
        in_ZMM31 = ZEXT3264(local_340);
        auVar79 = vmulps_avx512vl(local_340,auVar37);
        auVar44._4_4_ = uStack_35c;
        auVar44._0_4_ = local_360;
        auVar44._8_4_ = uStack_358;
        auVar44._12_4_ = uStack_354;
        auVar44._16_4_ = uStack_350;
        auVar44._20_4_ = uStack_34c;
        auVar44._24_4_ = uStack_348;
        auVar44._28_4_ = uStack_344;
        auVar83 = vmulps_avx512vl(auVar44,auVar37);
        auVar80 = vfmadd213ps_avx512vl(auVar74,auVar38,auVar81);
        auVar78 = vsubps_avx512vl(auVar78,auVar80);
        auVar80 = vfmadd213ps_avx512vl(auVar75,auVar38,auVar82);
        auVar80 = vsubps_avx512vl(auVar79,auVar80);
        auVar65 = vfmadd213ps_fma(auVar38,auVar86,local_860);
        auVar79 = vsubps_avx(auVar83,ZEXT1632(auVar65));
        auVar224 = auVar79._0_28_;
        auVar73 = vfmadd213ps_avx512vl(auVar95,auVar238,auVar73);
        auVar76 = vmulps_avx512vl(auVar76,auVar73);
        auVar73 = vmulps_avx512vl(local_3a0,auVar238);
        auVar83 = vmulps_avx512vl(local_340,auVar238);
        auVar84 = vmulps_avx512vl(auVar44,auVar238);
        auVar65 = vfmadd213ps_fma(auVar74,auVar76,auVar81);
        auVar79 = vsubps_avx(auVar73,ZEXT1632(auVar65));
        auVar65 = vfmadd213ps_fma(auVar75,auVar76,auVar82);
        auVar73 = vsubps_avx512vl(auVar83,ZEXT1632(auVar65));
        auVar65 = vfmadd213ps_fma(auVar86,auVar76,local_860);
        auVar74 = vsubps_avx512vl(auVar84,ZEXT1632(auVar65));
        auVar185 = ZEXT3264(auVar74);
        auVar172._8_4_ = 0x7f800000;
        auVar172._0_8_ = 0x7f8000007f800000;
        auVar172._12_4_ = 0x7f800000;
        auVar172._16_4_ = 0x7f800000;
        auVar172._20_4_ = 0x7f800000;
        auVar172._24_4_ = 0x7f800000;
        auVar172._28_4_ = 0x7f800000;
        auVar74 = vblendmps_avx512vl(auVar172,auVar37);
        bVar56 = (bool)((byte)uVar59 & 1);
        auVar92._0_4_ = (uint)bVar56 * auVar74._0_4_ | (uint)!bVar56 * auVar81._0_4_;
        bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar92._4_4_ = (uint)bVar56 * auVar74._4_4_ | (uint)!bVar56 * auVar81._4_4_;
        bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar92._8_4_ = (uint)bVar56 * auVar74._8_4_ | (uint)!bVar56 * auVar81._8_4_;
        bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar92._12_4_ = (uint)bVar56 * auVar74._12_4_ | (uint)!bVar56 * auVar81._12_4_;
        bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar92._16_4_ = (uint)bVar56 * auVar74._16_4_ | (uint)!bVar56 * auVar81._16_4_;
        bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar92._20_4_ = (uint)bVar56 * auVar74._20_4_ | (uint)!bVar56 * auVar81._20_4_;
        bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar92._24_4_ = (uint)bVar56 * auVar74._24_4_ | (uint)!bVar56 * auVar81._24_4_;
        bVar56 = SUB81(uVar59 >> 7,0);
        auVar92._28_4_ = (uint)bVar56 * auVar74._28_4_ | (uint)!bVar56 * auVar81._28_4_;
        auVar173._8_4_ = 0xff800000;
        auVar173._0_8_ = 0xff800000ff800000;
        auVar173._12_4_ = 0xff800000;
        auVar173._16_4_ = 0xff800000;
        auVar173._20_4_ = 0xff800000;
        auVar173._24_4_ = 0xff800000;
        auVar173._28_4_ = 0xff800000;
        auVar74 = vblendmps_avx512vl(auVar173,auVar238);
        bVar56 = (bool)((byte)uVar59 & 1);
        auVar96._0_4_ = (uint)bVar56 * auVar74._0_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar96._4_4_ = (uint)bVar56 * auVar74._4_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar96._8_4_ = (uint)bVar56 * auVar74._8_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar96._12_4_ = (uint)bVar56 * auVar74._12_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar96._16_4_ = (uint)bVar56 * auVar74._16_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar96._20_4_ = (uint)bVar56 * auVar74._20_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar96._24_4_ = (uint)bVar56 * auVar74._24_4_ | (uint)!bVar56 * -0x800000;
        bVar56 = SUB81(uVar59 >> 7,0);
        auVar96._28_4_ = (uint)bVar56 * auVar74._28_4_ | (uint)!bVar56 * -0x800000;
        auVar216._8_4_ = 0x7fffffff;
        auVar216._0_8_ = 0x7fffffff7fffffff;
        auVar216._12_4_ = 0x7fffffff;
        auVar216._16_4_ = 0x7fffffff;
        auVar216._20_4_ = 0x7fffffff;
        auVar216._24_4_ = 0x7fffffff;
        auVar216._28_4_ = 0x7fffffff;
        auVar74 = vandps_avx(auVar216,local_540);
        auVar74 = vmaxps_avx(local_280,auVar74);
        auVar27._8_4_ = 0x36000000;
        auVar27._0_8_ = 0x3600000036000000;
        auVar27._12_4_ = 0x36000000;
        auVar27._16_4_ = 0x36000000;
        auVar27._20_4_ = 0x36000000;
        auVar27._24_4_ = 0x36000000;
        auVar27._28_4_ = 0x36000000;
        auVar75 = vmulps_avx512vl(auVar74,auVar27);
        auVar74 = vandps_avx(auVar77,auVar216);
        uVar52 = vcmpps_avx512vl(auVar74,auVar75,1);
        uVar59 = uVar59 & uVar52;
        bVar50 = (byte)uVar59;
        if (bVar50 != 0) {
          uVar52 = vcmpps_avx512vl(auVar88,ZEXT1632(auVar64),2);
          auVar217._8_4_ = 0xff800000;
          auVar217._0_8_ = 0xff800000ff800000;
          auVar217._12_4_ = 0xff800000;
          auVar217._16_4_ = 0xff800000;
          auVar217._20_4_ = 0xff800000;
          auVar217._24_4_ = 0xff800000;
          auVar217._28_4_ = 0xff800000;
          auVar233._8_4_ = 0x7f800000;
          auVar233._0_8_ = 0x7f8000007f800000;
          auVar233._12_4_ = 0x7f800000;
          auVar233._16_4_ = 0x7f800000;
          auVar233._20_4_ = 0x7f800000;
          auVar233._24_4_ = 0x7f800000;
          auVar233._28_4_ = 0x7f800000;
          auVar88 = vblendmps_avx512vl(auVar233,auVar217);
          bVar47 = (byte)uVar52;
          uVar60 = (uint)(bVar47 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar75._0_4_;
          bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
          uVar110 = (uint)bVar56 * auVar88._4_4_ | (uint)!bVar56 * auVar75._4_4_;
          bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
          uVar111 = (uint)bVar56 * auVar88._8_4_ | (uint)!bVar56 * auVar75._8_4_;
          bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
          uVar112 = (uint)bVar56 * auVar88._12_4_ | (uint)!bVar56 * auVar75._12_4_;
          bVar56 = (bool)((byte)(uVar52 >> 4) & 1);
          uVar113 = (uint)bVar56 * auVar88._16_4_ | (uint)!bVar56 * auVar75._16_4_;
          bVar56 = (bool)((byte)(uVar52 >> 5) & 1);
          uVar114 = (uint)bVar56 * auVar88._20_4_ | (uint)!bVar56 * auVar75._20_4_;
          bVar56 = (bool)((byte)(uVar52 >> 6) & 1);
          uVar115 = (uint)bVar56 * auVar88._24_4_ | (uint)!bVar56 * auVar75._24_4_;
          bVar56 = SUB81(uVar52 >> 7,0);
          uVar116 = (uint)bVar56 * auVar88._28_4_ | (uint)!bVar56 * auVar75._28_4_;
          auVar92._0_4_ = (bVar50 & 1) * uVar60 | !(bool)(bVar50 & 1) * auVar92._0_4_;
          bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar92._4_4_ = bVar56 * uVar110 | !bVar56 * auVar92._4_4_;
          bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar92._8_4_ = bVar56 * uVar111 | !bVar56 * auVar92._8_4_;
          bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar92._12_4_ = bVar56 * uVar112 | !bVar56 * auVar92._12_4_;
          bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar92._16_4_ = bVar56 * uVar113 | !bVar56 * auVar92._16_4_;
          bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar92._20_4_ = bVar56 * uVar114 | !bVar56 * auVar92._20_4_;
          bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar92._24_4_ = bVar56 * uVar115 | !bVar56 * auVar92._24_4_;
          bVar56 = SUB81(uVar59 >> 7,0);
          auVar92._28_4_ = bVar56 * uVar116 | !bVar56 * auVar92._28_4_;
          auVar88 = vblendmps_avx512vl(auVar217,auVar233);
          bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar52 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar52 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar52 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar52 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar52 >> 6) & 1);
          bVar12 = SUB81(uVar52 >> 7,0);
          auVar96._0_4_ =
               (uint)(bVar50 & 1) *
               ((uint)(bVar47 & 1) * auVar88._0_4_ | !(bool)(bVar47 & 1) * uVar60) |
               !(bool)(bVar50 & 1) * auVar96._0_4_;
          bVar6 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar96._4_4_ =
               (uint)bVar6 * ((uint)bVar56 * auVar88._4_4_ | !bVar56 * uVar110) |
               !bVar6 * auVar96._4_4_;
          bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar96._8_4_ =
               (uint)bVar56 * ((uint)bVar7 * auVar88._8_4_ | !bVar7 * uVar111) |
               !bVar56 * auVar96._8_4_;
          bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar96._12_4_ =
               (uint)bVar56 * ((uint)bVar8 * auVar88._12_4_ | !bVar8 * uVar112) |
               !bVar56 * auVar96._12_4_;
          bVar56 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar96._16_4_ =
               (uint)bVar56 * ((uint)bVar9 * auVar88._16_4_ | !bVar9 * uVar113) |
               !bVar56 * auVar96._16_4_;
          bVar56 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar96._20_4_ =
               (uint)bVar56 * ((uint)bVar10 * auVar88._20_4_ | !bVar10 * uVar114) |
               !bVar56 * auVar96._20_4_;
          bVar56 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar96._24_4_ =
               (uint)bVar56 * ((uint)bVar11 * auVar88._24_4_ | !bVar11 * uVar115) |
               !bVar56 * auVar96._24_4_;
          bVar56 = SUB81(uVar59 >> 7,0);
          auVar96._28_4_ =
               (uint)bVar56 * ((uint)bVar12 * auVar88._28_4_ | !bVar12 * uVar116) |
               !bVar56 * auVar96._28_4_;
          bVar53 = (~bVar50 | bVar47) & bVar53;
        }
      }
      auVar250 = ZEXT3264(local_720);
      auVar251 = ZEXT3264(local_740);
      auVar252 = ZEXT3264(local_760);
      auVar242 = ZEXT3264(local_780);
      auVar243 = ZEXT3264(local_7a0);
      auVar247 = ZEXT3264(local_7c0);
      uVar199 = *(undefined4 *)&(ray->dir).field_0;
      auVar206._4_4_ = uVar199;
      auVar206._0_4_ = uVar199;
      auVar206._8_4_ = uVar199;
      auVar206._12_4_ = uVar199;
      auVar206._16_4_ = uVar199;
      auVar206._20_4_ = uVar199;
      auVar206._24_4_ = uVar199;
      auVar206._28_4_ = uVar199;
      uVar199 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar218._4_4_ = uVar199;
      auVar218._0_4_ = uVar199;
      auVar218._8_4_ = uVar199;
      auVar218._12_4_ = uVar199;
      auVar218._16_4_ = uVar199;
      auVar218._20_4_ = uVar199;
      auVar218._24_4_ = uVar199;
      auVar218._28_4_ = uVar199;
      fVar223 = (ray->dir).field_0.m128[2];
      auVar232._0_4_ = fVar223 * auVar185._0_4_;
      auVar232._4_4_ = fVar223 * auVar185._4_4_;
      auVar232._8_4_ = fVar223 * auVar185._8_4_;
      auVar232._12_4_ = fVar223 * auVar185._12_4_;
      auVar232._16_4_ = fVar223 * auVar185._16_4_;
      auVar232._20_4_ = fVar223 * auVar185._20_4_;
      auVar232._28_36_ = auVar185._28_36_;
      auVar232._24_4_ = fVar223 * auVar185._24_4_;
      auVar65 = vfmadd231ps_fma(auVar232._0_32_,auVar218,auVar73);
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar206,auVar79);
      _local_260 = _local_3c0;
      local_240 = vminps_avx(local_200,auVar92);
      auVar231._8_4_ = 0x7fffffff;
      auVar231._0_8_ = 0x7fffffff7fffffff;
      auVar231._12_4_ = 0x7fffffff;
      auVar231._16_4_ = 0x7fffffff;
      auVar231._20_4_ = 0x7fffffff;
      auVar231._24_4_ = 0x7fffffff;
      auVar231._28_4_ = 0x7fffffff;
      auVar88 = vandps_avx(auVar231,ZEXT1632(auVar65));
      _local_380 = vmaxps_avx(_local_3c0,auVar96);
      _local_220 = _local_380;
      auVar174._8_4_ = 0x3e99999a;
      auVar174._0_8_ = 0x3e99999a3e99999a;
      auVar174._12_4_ = 0x3e99999a;
      auVar174._16_4_ = 0x3e99999a;
      auVar174._20_4_ = 0x3e99999a;
      auVar174._24_4_ = 0x3e99999a;
      auVar174._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar88,auVar174,1);
      local_7c4 = (undefined4)uVar14;
      uVar14 = vcmpps_avx512vl(_local_3c0,local_240,2);
      bVar50 = (byte)uVar14 & bVar51;
      uVar15 = vcmpps_avx512vl(_local_380,local_200,2);
      auVar244 = ZEXT3264(local_600);
      auVar245 = ZEXT3264(local_620);
      auVar248 = ZEXT3264(local_640);
      if ((bVar51 & ((byte)uVar15 | (byte)uVar14)) == 0) {
        auVar241 = ZEXT3264(local_6a0);
        auVar234 = ZEXT3264(local_6c0);
        auVar232 = ZEXT3264(local_3e0);
        auVar185 = ZEXT3264(local_480);
        auVar246 = ZEXT3264(local_660);
      }
      else {
        auVar39._4_4_ = auVar224._4_4_ * fVar223;
        auVar39._0_4_ = auVar224._0_4_ * fVar223;
        auVar39._8_4_ = auVar224._8_4_ * fVar223;
        auVar39._12_4_ = auVar224._12_4_ * fVar223;
        auVar39._16_4_ = auVar224._16_4_ * fVar223;
        auVar39._20_4_ = auVar224._20_4_ * fVar223;
        auVar39._24_4_ = auVar224._24_4_ * fVar223;
        auVar39._28_4_ = 0x3e99999a;
        auVar65 = vfmadd213ps_fma(auVar80,auVar218,auVar39);
        auVar65 = vfmadd213ps_fma(auVar78,auVar206,ZEXT1632(auVar65));
        auVar88 = vandps_avx(auVar231,ZEXT1632(auVar65));
        uVar14 = vcmpps_avx512vl(auVar88,auVar174,1);
        local_7cc = (uint)(byte)~bVar53;
        bVar53 = (byte)uVar14 | ~bVar53;
        auVar130._8_4_ = 2;
        auVar130._0_8_ = 0x200000002;
        auVar130._12_4_ = 2;
        auVar130._16_4_ = 2;
        auVar130._20_4_ = 2;
        auVar130._24_4_ = 2;
        auVar130._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar88 = vpblendmd_avx512vl(auVar130,auVar28);
        local_1e0._0_4_ = (uint)(bVar53 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar56 = (bool)(bVar53 >> 1 & 1);
        local_1e0._4_4_ = (uint)bVar56 * auVar88._4_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar53 >> 2 & 1);
        local_1e0._8_4_ = (uint)bVar56 * auVar88._8_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar53 >> 3 & 1);
        local_1e0._12_4_ = (uint)bVar56 * auVar88._12_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar53 >> 4 & 1);
        local_1e0._16_4_ = (uint)bVar56 * auVar88._16_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar53 >> 5 & 1);
        local_1e0._20_4_ = (uint)bVar56 * auVar88._20_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar53 >> 6 & 1);
        local_1e0._24_4_ = (uint)bVar56 * auVar88._24_4_ | (uint)!bVar56 * 2;
        local_1e0._28_4_ = (uint)(bVar53 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2;
        local_2a0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_2a0,local_1e0,5);
        local_7c8 = (uint)bVar50;
        bVar50 = (byte)uVar14 & bVar50;
        if (bVar50 == 0) {
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar241 = ZEXT3264(local_6a0);
          auVar234 = ZEXT3264(local_6c0);
          auVar246 = ZEXT3264(local_660);
        }
        else {
          auVar64 = vminps_avx(local_400._0_16_,local_440._0_16_);
          auVar65 = vmaxps_avx(local_400._0_16_,local_440._0_16_);
          auVar68 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar69 = vminps_avx(auVar64,auVar68);
          auVar64 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar68 = vmaxps_avx(auVar65,auVar64);
          auVar157._8_4_ = 0x7fffffff;
          auVar157._0_8_ = 0x7fffffff7fffffff;
          auVar157._12_4_ = 0x7fffffff;
          auVar65 = vandps_avx(auVar69,auVar157);
          auVar64 = vandps_avx(auVar68,auVar157);
          auVar65 = vmaxps_avx(auVar65,auVar64);
          auVar64 = vmovshdup_avx(auVar65);
          auVar64 = vmaxss_avx(auVar64,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar64);
          fVar200 = auVar65._0_4_ * 1.9073486e-06;
          local_4f0 = vshufps_avx(auVar68,auVar68,0xff);
          local_320 = (float)local_580._0_4_ + (float)local_3c0._0_4_;
          fStack_31c = (float)local_580._4_4_ + (float)local_3c0._4_4_;
          fStack_318 = fStack_578 + fStack_3b8;
          fStack_314 = fStack_574 + fStack_3b4;
          fStack_310 = fStack_570 + fStack_3b0;
          fStack_30c = fStack_56c + fStack_3ac;
          fStack_308 = fStack_568 + fStack_3a8;
          fStack_304 = fStack_564 + fStack_3a4;
          do {
            auVar74 = _local_820;
            auVar131._8_4_ = 0x7f800000;
            auVar131._0_8_ = 0x7f8000007f800000;
            auVar131._12_4_ = 0x7f800000;
            auVar131._16_4_ = 0x7f800000;
            auVar131._20_4_ = 0x7f800000;
            auVar131._24_4_ = 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar131,_local_3c0);
            auVar107._0_4_ =
                 (uint)(bVar50 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar50 & 1) * 0x7f800000;
            bVar56 = (bool)(bVar50 >> 1 & 1);
            auVar107._4_4_ = (uint)bVar56 * auVar88._4_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar50 >> 2 & 1);
            auVar107._8_4_ = (uint)bVar56 * auVar88._8_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar50 >> 3 & 1);
            auVar107._12_4_ = (uint)bVar56 * auVar88._12_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar50 >> 4 & 1);
            auVar107._16_4_ = (uint)bVar56 * auVar88._16_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar50 >> 5 & 1);
            auVar107._20_4_ = (uint)bVar56 * auVar88._20_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar50 >> 6 & 1);
            auVar107._24_4_ = (uint)bVar56 * auVar88._24_4_ | (uint)!bVar56 * 0x7f800000;
            auVar107._28_4_ =
                 (uint)(bVar50 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar50 >> 7) * 0x7f800000;
            auVar88 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar88 = vminps_avx(auVar107,auVar88);
            auVar73 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar73);
            auVar73 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar73);
            uVar14 = vcmpps_avx512vl(auVar107,auVar88,0);
            bVar47 = (byte)uVar14 & bVar50;
            bVar53 = bVar50;
            if (bVar47 != 0) {
              bVar53 = bVar47;
            }
            iVar17 = 0;
            for (uVar60 = (uint)bVar53; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_540._0_16_ = (undefined1  [16])aVar1;
            auVar65 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar65._0_4_ < 0.0) {
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_2e0 + (uint)(iVar17 << 2)));
              local_860._0_16_ = ZEXT416((uint)*(float *)(local_260 + (uint)(iVar17 << 2)));
              local_820[1] = 0;
              local_820[0] = bVar50;
              stack0xfffffffffffff7e2 = auVar74._2_30_;
              fVar209 = sqrtf(auVar65._0_4_);
              bVar50 = local_820[0];
              fVar208 = (float)local_840._0_4_;
              uVar199 = local_840._4_4_;
              uVar221 = local_840._8_4_;
              uVar222 = local_840._12_4_;
              fVar207 = (float)local_860._0_4_;
              uVar235 = local_860._4_4_;
              uVar236 = local_860._8_4_;
              uVar237 = local_860._12_4_;
            }
            else {
              auVar65 = vsqrtss_avx(auVar65,auVar65);
              fVar209 = auVar65._0_4_;
              fVar208 = *(float *)(local_2e0 + (uint)(iVar17 << 2));
              uVar199 = 0;
              uVar221 = 0;
              uVar222 = 0;
              fVar207 = *(float *)(local_260 + (uint)(iVar17 << 2));
              uVar235 = 0;
              uVar236 = 0;
              uVar237 = 0;
            }
            lVar54 = 5;
            do {
              auVar73 = local_840;
              auVar88 = local_860;
              auVar120._4_4_ = fVar207;
              auVar120._0_4_ = fVar207;
              auVar120._8_4_ = fVar207;
              auVar120._12_4_ = fVar207;
              auVar64 = vfmadd132ps_fma(auVar120,ZEXT816(0) << 0x40,local_540._0_16_);
              fVar117 = 1.0 - fVar208;
              auVar158._0_4_ = local_440._0_4_ * fVar208;
              auVar158._4_4_ = local_440._4_4_ * fVar208;
              auVar158._8_4_ = local_440._8_4_ * fVar208;
              auVar158._12_4_ = local_440._12_4_ * fVar208;
              local_490 = ZEXT416((uint)fVar117);
              auVar181._4_4_ = fVar117;
              auVar181._0_4_ = fVar117;
              auVar181._8_4_ = fVar117;
              auVar181._12_4_ = fVar117;
              auVar65 = vfmadd231ps_fma(auVar158,auVar181,local_400._0_16_);
              auVar188._0_4_ = local_420._0_4_ * fVar208;
              auVar188._4_4_ = local_420._4_4_ * fVar208;
              auVar188._8_4_ = local_420._8_4_ * fVar208;
              auVar188._12_4_ = local_420._12_4_ * fVar208;
              auVar68 = vfmadd231ps_fma(auVar188,auVar181,local_440._0_16_);
              auVar197._0_4_ = fVar208 * (float)local_460._0_4_;
              auVar197._4_4_ = fVar208 * (float)local_460._4_4_;
              auVar197._8_4_ = fVar208 * fStack_458;
              auVar197._12_4_ = fVar208 * fStack_454;
              auVar69 = vfmadd231ps_fma(auVar197,auVar181,local_420._0_16_);
              auVar203._0_4_ = fVar208 * auVar68._0_4_;
              auVar203._4_4_ = fVar208 * auVar68._4_4_;
              auVar203._8_4_ = fVar208 * auVar68._8_4_;
              auVar203._12_4_ = fVar208 * auVar68._12_4_;
              auVar65 = vfmadd231ps_fma(auVar203,auVar181,auVar65);
              auVar159._0_4_ = fVar208 * auVar69._0_4_;
              auVar159._4_4_ = fVar208 * auVar69._4_4_;
              auVar159._8_4_ = fVar208 * auVar69._8_4_;
              auVar159._12_4_ = fVar208 * auVar69._12_4_;
              auVar68 = vfmadd231ps_fma(auVar159,auVar181,auVar68);
              auVar189._0_4_ = fVar208 * auVar68._0_4_;
              auVar189._4_4_ = fVar208 * auVar68._4_4_;
              auVar189._8_4_ = fVar208 * auVar68._8_4_;
              auVar189._12_4_ = fVar208 * auVar68._12_4_;
              local_700 = vfmadd231ps_fma(auVar189,auVar65,auVar181);
              auVar65 = vsubps_avx(auVar68,auVar65);
              auVar19._8_4_ = 0x40400000;
              auVar19._0_8_ = 0x4040000040400000;
              auVar19._12_4_ = 0x40400000;
              auVar65 = vmulps_avx512vl(auVar65,auVar19);
              _local_820 = auVar65;
              auVar65 = vsubps_avx(auVar64,local_700);
              _local_560 = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              local_520._0_16_ = auVar65;
              local_840._4_4_ = uVar199;
              local_840._0_4_ = fVar208;
              local_840._8_4_ = uVar221;
              local_840._16_16_ = auVar73._16_16_;
              local_840._12_4_ = uVar222;
              local_860._4_4_ = uVar235;
              local_860._0_4_ = fVar207;
              local_860._8_4_ = uVar236;
              local_860._16_16_ = auVar88._16_16_;
              local_860._12_4_ = uVar237;
              if (auVar65._0_4_ < 0.0) {
                auVar185._0_4_ = sqrtf(auVar65._0_4_);
                auVar185._4_60_ = extraout_var;
                auVar65 = auVar185._0_16_;
              }
              else {
                auVar65 = vsqrtss_avx(auVar65,auVar65);
              }
              local_4a0 = vdpps_avx(_local_820,_local_820,0x7f);
              fVar208 = local_4a0._0_4_;
              auVar160._4_12_ = ZEXT812(0) << 0x20;
              auVar160._0_4_ = fVar208;
              local_7f0 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
              fVar207 = local_7f0._0_4_ * 1.5;
              local_4b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(local_4a0,auVar20);
              auVar64 = vfnmadd213ss_fma(local_4b0,local_4a0,ZEXT416(0x40000000));
              uVar60 = auVar65._0_4_;
              if (fVar208 < auVar68._0_4_) {
                local_800._0_4_ = fVar207;
                fVar117 = sqrtf(fVar208);
                auVar65 = ZEXT416(uVar60);
              }
              else {
                auVar68 = vsqrtss_avx(local_4a0,local_4a0);
                fVar117 = auVar68._0_4_;
                local_800._0_4_ = fVar207;
              }
              fVar207 = local_7f0._0_4_;
              fVar207 = (float)local_800._0_4_ + fVar208 * -0.5 * fVar207 * fVar207 * fVar207;
              local_800._0_4_ = fVar207 * (float)local_820._0_4_;
              local_800._4_4_ = fVar207 * (float)local_820._4_4_;
              local_800._8_4_ = fVar207 * fStack_818;
              local_800._12_4_ = fVar207 * fStack_814;
              local_7f0 = vdpps_avx(local_800,_local_560,0x7f);
              auVar66 = vaddss_avx512f(auVar65,ZEXT416(0x3f800000));
              auVar121._0_4_ = local_7f0._0_4_ * local_7f0._0_4_;
              auVar121._4_4_ = local_7f0._4_4_ * local_7f0._4_4_;
              auVar121._8_4_ = local_7f0._8_4_ * local_7f0._8_4_;
              auVar121._12_4_ = local_7f0._12_4_ * local_7f0._12_4_;
              auVar68 = vsubps_avx(local_520._0_16_,auVar121);
              fVar208 = auVar68._0_4_;
              auVar138._4_12_ = ZEXT812(0) << 0x20;
              auVar138._0_4_ = fVar208;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar138);
              auVar70 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              uVar57 = fVar208 == 0.0;
              uVar55 = fVar208 < 0.0;
              if ((bool)uVar55) {
                local_4d0 = fVar207;
                fStack_4cc = fVar207;
                fStack_4c8 = fVar207;
                fStack_4c4 = fVar207;
                local_4c0 = auVar69;
                fVar210 = sqrtf(fVar208);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar65 = ZEXT416(uVar60);
                auVar66 = ZEXT416(auVar66._0_4_);
                auVar69 = local_4c0;
                fVar207 = local_4d0;
                fVar211 = fStack_4cc;
                fVar212 = fStack_4c8;
                fVar223 = fStack_4c4;
              }
              else {
                auVar68 = vsqrtss_avx(auVar68,auVar68);
                fVar210 = auVar68._0_4_;
                fVar211 = fVar207;
                fVar212 = fVar207;
                fVar223 = fVar207;
              }
              auVar241 = ZEXT3264(local_6a0);
              auVar234 = ZEXT3264(local_6c0);
              auVar250 = ZEXT3264(local_720);
              auVar251 = ZEXT3264(local_740);
              auVar252 = ZEXT3264(local_760);
              auVar242 = ZEXT3264(local_780);
              auVar243 = ZEXT3264(local_7a0);
              auVar244 = ZEXT3264(local_600);
              auVar247 = ZEXT3264(local_7c0);
              auVar246 = ZEXT3264(local_660);
              auVar249 = ZEXT3264(local_680);
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,local_490);
              fVar225 = auVar68._0_4_ * 6.0;
              fVar226 = local_840._0_4_ * 6.0;
              auVar161._0_4_ = fVar226 * (float)local_460._0_4_;
              auVar161._4_4_ = fVar226 * (float)local_460._4_4_;
              auVar161._8_4_ = fVar226 * fStack_458;
              auVar161._12_4_ = fVar226 * fStack_454;
              auVar139._4_4_ = fVar225;
              auVar139._0_4_ = fVar225;
              auVar139._8_4_ = fVar225;
              auVar139._12_4_ = fVar225;
              auVar68 = vfmadd132ps_fma(auVar139,auVar161,local_420._0_16_);
              auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_490,local_840._0_16_);
              fVar225 = auVar67._0_4_ * 6.0;
              auVar162._4_4_ = fVar225;
              auVar162._0_4_ = fVar225;
              auVar162._8_4_ = fVar225;
              auVar162._12_4_ = fVar225;
              auVar68 = vfmadd132ps_fma(auVar162,auVar68,local_440._0_16_);
              fVar225 = local_490._0_4_ * 6.0;
              auVar140._4_4_ = fVar225;
              auVar140._0_4_ = fVar225;
              auVar140._8_4_ = fVar225;
              auVar140._12_4_ = fVar225;
              auVar68 = vfmadd132ps_fma(auVar140,auVar68,local_400._0_16_);
              auVar163._0_4_ = auVar68._0_4_ * (float)local_4a0._0_4_;
              auVar163._4_4_ = auVar68._4_4_ * (float)local_4a0._0_4_;
              auVar163._8_4_ = auVar68._8_4_ * (float)local_4a0._0_4_;
              auVar163._12_4_ = auVar68._12_4_ * (float)local_4a0._0_4_;
              auVar68 = vdpps_avx(_local_820,auVar68,0x7f);
              fVar225 = auVar68._0_4_;
              auVar141._0_4_ = local_820._0_4_ * fVar225;
              auVar141._4_4_ = local_820._4_4_ * fVar225;
              auVar141._8_4_ = local_820._8_4_ * fVar225;
              auVar141._12_4_ = local_820._12_4_ * fVar225;
              auVar68 = vsubps_avx(auVar163,auVar141);
              fVar225 = auVar64._0_4_ * (float)local_4b0._0_4_;
              auVar67 = vmaxss_avx(ZEXT416((uint)fVar200),
                                   ZEXT416((uint)((float)local_860._0_4_ * fVar209 * 1.9073486e-06))
                                  );
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar71 = vxorps_avx512vl(_local_820,auVar21);
              auVar164._0_4_ = fVar207 * auVar68._0_4_ * fVar225;
              auVar164._4_4_ = fVar211 * auVar68._4_4_ * fVar225;
              auVar164._8_4_ = fVar212 * auVar68._8_4_ * fVar225;
              auVar164._12_4_ = fVar223 * auVar68._12_4_ * fVar225;
              auVar64 = vdpps_avx(auVar71,local_800,0x7f);
              auVar68 = vfmadd213ss_fma(auVar65,ZEXT416((uint)fVar200),auVar67);
              auVar65 = vdpps_avx(_local_560,auVar164,0x7f);
              vfmadd213ss_avx512f(auVar66,ZEXT416((uint)(fVar200 / fVar117)),auVar68);
              fVar207 = auVar64._0_4_ + auVar65._0_4_;
              auVar65 = vdpps_avx(local_540._0_16_,local_800,0x7f);
              auVar64 = vdpps_avx(_local_560,auVar71,0x7f);
              auVar68 = vmulss_avx512f(auVar69,ZEXT416((uint)(fVar208 * -0.5)));
              auVar69 = vmulss_avx512f(auVar69,auVar69);
              auVar70 = vaddss_avx512f(auVar70,ZEXT416((uint)(auVar68._0_4_ * auVar69._0_4_)));
              auVar68 = vdpps_avx(_local_560,local_540._0_16_,0x7f);
              auVar69 = vfnmadd231ss_fma(auVar64,local_7f0,ZEXT416((uint)fVar207));
              auVar66 = vfnmadd231ss_fma(auVar68,local_7f0,auVar65);
              auVar64 = vpermilps_avx(local_700,0xff);
              fVar210 = fVar210 - auVar64._0_4_;
              auVar64 = vshufps_avx(_local_820,_local_820,0xff);
              auVar68 = vfmsub213ss_fma(auVar69,auVar70,auVar64);
              fVar208 = auVar66._0_4_ * auVar70._0_4_;
              auVar69 = vfmsub231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar68._0_4_)),
                                        ZEXT416((uint)fVar207),ZEXT416((uint)fVar208));
              fVar117 = auVar69._0_4_;
              fVar208 = local_840._0_4_ -
                        (local_7f0._0_4_ * (fVar208 / fVar117) - fVar210 * (auVar65._0_4_ / fVar117)
                        );
              uVar199 = 0;
              uVar221 = 0;
              uVar222 = 0;
              fVar207 = (float)local_860._0_4_ -
                        (fVar210 * (fVar207 / fVar117) - local_7f0._0_4_ * (auVar68._0_4_ / fVar117)
                        );
              uVar235 = 0;
              uVar236 = 0;
              uVar237 = 0;
              auVar190._8_4_ = 0x7fffffff;
              auVar190._0_8_ = 0x7fffffff7fffffff;
              auVar190._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx(local_7f0,auVar190);
              auVar65 = vucomiss_avx512f(auVar65);
              bVar56 = true;
              if (!(bool)uVar55 && !(bool)uVar57) {
                auVar65 = vaddss_avx512f(auVar67,auVar65);
                auVar68 = vfmadd231ss_fma(auVar65,local_4f0,ZEXT416(0x36000000));
                auVar65 = vandps_avx(ZEXT416((uint)fVar210),auVar190);
                if (auVar65._0_4_ < auVar68._0_4_) {
                  fVar207 = fVar207 + (float)local_4e0._0_4_;
                  uVar235 = 0;
                  uVar236 = 0;
                  uVar237 = 0;
                  if (((((ray->org).field_0.m128[3] <= fVar207) &&
                       (fVar117 = ray->tfar, fVar207 <= fVar117)) && (0.0 <= fVar208)) &&
                     (fVar208 <= 1.0)) {
                    auVar41._12_4_ = 0;
                    auVar41._0_12_ = ZEXT812(0);
                    auVar65 = vrsqrt14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)local_520._0_4_));
                    fVar210 = auVar65._0_4_;
                    pGVar4 = (context->scene->geometries).items[local_868].ptr;
                    if ((pGVar4->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13 = 1;
                      }
                      else {
                        fVar210 = fVar210 * 1.5 +
                                  (float)local_520._0_4_ * -0.5 * fVar210 * fVar210 * fVar210;
                        auVar142._0_4_ = fVar210 * (float)local_560._0_4_;
                        auVar142._4_4_ = fVar210 * (float)local_560._4_4_;
                        auVar142._8_4_ = fVar210 * fStack_558;
                        auVar142._12_4_ = fVar210 * fStack_554;
                        auVar69 = vfmadd213ps_fma(auVar64,auVar142,_local_820);
                        auVar65 = vshufps_avx(auVar142,auVar142,0xc9);
                        auVar64 = vshufps_avx(_local_820,_local_820,0xc9);
                        auVar143._0_4_ = auVar142._0_4_ * auVar64._0_4_;
                        auVar143._4_4_ = auVar142._4_4_ * auVar64._4_4_;
                        auVar143._8_4_ = auVar142._8_4_ * auVar64._8_4_;
                        auVar143._12_4_ = auVar142._12_4_ * auVar64._12_4_;
                        auVar68 = vfmsub231ps_fma(auVar143,_local_820,auVar65);
                        auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar64 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                        auVar122._0_4_ = auVar69._0_4_ * auVar68._0_4_;
                        auVar122._4_4_ = auVar69._4_4_ * auVar68._4_4_;
                        auVar122._8_4_ = auVar69._8_4_ * auVar68._8_4_;
                        auVar122._12_4_ = auVar69._12_4_ * auVar68._12_4_;
                        auVar64 = vfmsub231ps_fma(auVar122,auVar65,auVar64);
                        auVar65 = vshufps_avx(auVar64,auVar64,0xe9);
                        local_5d0 = vmovlps_avx(auVar65);
                        local_5c8 = auVar64._0_4_;
                        local_5c0 = 0;
                        local_5bc = (undefined4)local_870;
                        local_5b8 = (undefined4)local_868;
                        local_5b4 = context->user->instID[0];
                        local_5b0 = context->user->instPrimID[0];
                        ray->tfar = fVar207;
                        local_874 = -1;
                        local_6f0.valid = &local_874;
                        local_6f0.geometryUserPtr = pGVar4->userPtr;
                        local_6f0.context = context->user;
                        local_6f0.hit = (RTCHitN *)&local_5d0;
                        local_6f0.N = 1;
                        local_840._0_16_ = ZEXT416((uint)fVar208);
                        local_860._0_16_ = ZEXT416((uint)fVar207);
                        local_700._0_4_ = fVar117;
                        local_6f0.ray = (RTCRayN *)ray;
                        local_5c4 = fVar208;
                        if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b836d3:
                          p_Var5 = context->args->filter;
                          if (p_Var5 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var5)(&local_6f0);
                              auVar249 = ZEXT3264(local_680);
                              auVar246 = ZEXT3264(local_660);
                              auVar247 = ZEXT3264(local_7c0);
                              auVar244 = ZEXT3264(local_600);
                              auVar243 = ZEXT3264(local_7a0);
                              auVar242 = ZEXT3264(local_780);
                              auVar252 = ZEXT3264(local_760);
                              auVar251 = ZEXT3264(local_740);
                              auVar250 = ZEXT3264(local_720);
                              auVar234 = ZEXT3264(local_6c0);
                              auVar241 = ZEXT3264(local_6a0);
                              auVar190._8_4_ = 0x7fffffff;
                              auVar190._0_8_ = 0x7fffffff7fffffff;
                              auVar190._12_4_ = 0x7fffffff;
                              fVar117 = (float)local_700._0_4_;
                              fVar208 = (float)local_840._0_4_;
                              uVar199 = local_840._4_4_;
                              uVar221 = local_840._8_4_;
                              uVar222 = local_840._12_4_;
                              fVar207 = (float)local_860._0_4_;
                              uVar235 = local_860._4_4_;
                              uVar236 = local_860._8_4_;
                              uVar237 = local_860._12_4_;
                            }
                            if (*local_6f0.valid == 0) goto LAB_01b837a2;
                          }
                          unaff_R13 = 1;
                        }
                        else {
                          (*pGVar4->occlusionFilterN)(&local_6f0);
                          auVar249 = ZEXT3264(local_680);
                          auVar246 = ZEXT3264(local_660);
                          auVar247 = ZEXT3264(local_7c0);
                          auVar244 = ZEXT3264(local_600);
                          auVar243 = ZEXT3264(local_7a0);
                          auVar242 = ZEXT3264(local_780);
                          auVar252 = ZEXT3264(local_760);
                          auVar251 = ZEXT3264(local_740);
                          auVar250 = ZEXT3264(local_720);
                          auVar234 = ZEXT3264(local_6c0);
                          auVar241 = ZEXT3264(local_6a0);
                          auVar190._8_4_ = 0x7fffffff;
                          auVar190._0_8_ = 0x7fffffff7fffffff;
                          auVar190._12_4_ = 0x7fffffff;
                          fVar117 = (float)local_700._0_4_;
                          fVar208 = (float)local_840._0_4_;
                          uVar199 = local_840._4_4_;
                          uVar221 = local_840._8_4_;
                          uVar222 = local_840._12_4_;
                          fVar207 = (float)local_860._0_4_;
                          uVar235 = local_860._4_4_;
                          uVar236 = local_860._8_4_;
                          uVar237 = local_860._12_4_;
                          if (*local_6f0.valid != 0) goto LAB_01b836d3;
LAB_01b837a2:
                          unaff_R13 = 0;
                        }
                        if ((char)unaff_R13 == '\0') {
                          ray->tfar = fVar117;
                        }
                      }
                      bVar56 = false;
                      goto LAB_01b834e4;
                    }
                  }
                  bVar56 = false;
                  unaff_R13 = 0;
                }
              }
LAB_01b834e4:
              bVar53 = (byte)unaff_R13;
              if (!bVar56) goto LAB_01b837c5;
              lVar54 = lVar54 + -1;
            } while (lVar54 != 0);
            bVar53 = 0;
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
LAB_01b837c5:
            unaff_R13 = (ulong)(bVar53 & 1);
            bVar49 = bVar49 | bVar53 & 1;
            auVar45._4_4_ = fStack_31c;
            auVar45._0_4_ = local_320;
            auVar45._8_4_ = fStack_318;
            auVar45._12_4_ = fStack_314;
            auVar45._16_4_ = fStack_310;
            auVar45._20_4_ = fStack_30c;
            auVar45._24_4_ = fStack_308;
            auVar45._28_4_ = fStack_304;
            fVar207 = ray->tfar;
            auVar29._4_4_ = fVar207;
            auVar29._0_4_ = fVar207;
            auVar29._8_4_ = fVar207;
            auVar29._12_4_ = fVar207;
            auVar29._16_4_ = fVar207;
            auVar29._20_4_ = fVar207;
            auVar29._24_4_ = fVar207;
            auVar29._28_4_ = fVar207;
            uVar14 = vcmpps_avx512vl(auVar45,auVar29,2);
            bVar50 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar50 & (byte)uVar14;
          } while (bVar50 != 0);
        }
        auVar132._0_4_ = (float)local_580._0_4_ + (float)local_380._0_4_;
        auVar132._4_4_ = (float)local_580._4_4_ + (float)local_380._4_4_;
        auVar132._8_4_ = fStack_578 + fStack_378;
        auVar132._12_4_ = fStack_574 + fStack_374;
        auVar132._16_4_ = fStack_570 + fStack_370;
        auVar132._20_4_ = fStack_56c + fStack_36c;
        auVar132._24_4_ = fStack_568 + fStack_368;
        auVar132._28_4_ = fStack_564 + fStack_364;
        fVar200 = ray->tfar;
        auVar30._4_4_ = fVar200;
        auVar30._0_4_ = fVar200;
        auVar30._8_4_ = fVar200;
        auVar30._12_4_ = fVar200;
        auVar30._16_4_ = fVar200;
        auVar30._20_4_ = fVar200;
        auVar30._24_4_ = fVar200;
        auVar30._28_4_ = fVar200;
        uVar14 = vcmpps_avx512vl(auVar132,auVar30,2);
        bVar53 = (byte)local_7c4 | (byte)local_7cc;
        bVar51 = (byte)uVar15 & bVar51 & (byte)uVar14;
        auVar133._8_4_ = 2;
        auVar133._0_8_ = 0x200000002;
        auVar133._12_4_ = 2;
        auVar133._16_4_ = 2;
        auVar133._20_4_ = 2;
        auVar133._24_4_ = 2;
        auVar133._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar88 = vpblendmd_avx512vl(auVar133,auVar31);
        local_380._0_4_ = (uint)(bVar53 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar56 = (bool)(bVar53 >> 1 & 1);
        local_380._4_4_ = (uint)bVar56 * auVar88._4_4_ | (uint)!bVar56 * 2;
        bVar56 = (bool)(bVar53 >> 2 & 1);
        fStack_378 = (float)((uint)bVar56 * auVar88._8_4_ | (uint)!bVar56 * 2);
        bVar56 = (bool)(bVar53 >> 3 & 1);
        fStack_374 = (float)((uint)bVar56 * auVar88._12_4_ | (uint)!bVar56 * 2);
        bVar56 = (bool)(bVar53 >> 4 & 1);
        fStack_370 = (float)((uint)bVar56 * auVar88._16_4_ | (uint)!bVar56 * 2);
        bVar56 = (bool)(bVar53 >> 5 & 1);
        fStack_36c = (float)((uint)bVar56 * auVar88._20_4_ | (uint)!bVar56 * 2);
        bVar56 = (bool)(bVar53 >> 6 & 1);
        fStack_368 = (float)((uint)bVar56 * auVar88._24_4_ | (uint)!bVar56 * 2);
        fStack_364 = (float)((uint)(bVar53 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2);
        uVar14 = vpcmpd_avx512vl(_local_380,local_2a0,2);
        bVar53 = (byte)uVar14 & bVar51;
        fVar200 = (float)local_580._0_4_;
        fVar207 = (float)local_580._4_4_;
        fVar208 = fStack_578;
        fVar209 = fStack_574;
        fVar117 = fStack_570;
        fVar210 = fStack_56c;
        fVar211 = fStack_568;
        fVar212 = fStack_564;
        if (bVar53 != 0) {
          auVar64 = vminps_avx(local_400._0_16_,local_440._0_16_);
          auVar65 = vmaxps_avx(local_400._0_16_,local_440._0_16_);
          auVar68 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar69 = vminps_avx(auVar64,auVar68);
          auVar64 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar68 = vmaxps_avx(auVar65,auVar64);
          auVar65 = vandps_avx(auVar69,auVar190);
          auVar64 = vandps_avx(auVar68,auVar190);
          auVar65 = vmaxps_avx(auVar65,auVar64);
          auVar64 = vmovshdup_avx(auVar65);
          auVar64 = vmaxss_avx(auVar64,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar64);
          fVar223 = auVar65._0_4_ * 1.9073486e-06;
          local_4f0 = vshufps_avx(auVar68,auVar68,0xff);
          _local_3c0 = _local_220;
          local_320 = (float)local_580._0_4_ + (float)local_220._0_4_;
          fStack_31c = (float)local_580._4_4_ + (float)local_220._4_4_;
          fStack_318 = fStack_578 + fStack_218;
          fStack_314 = fStack_574 + fStack_214;
          fStack_310 = fStack_570 + fStack_210;
          fStack_30c = fStack_56c + fStack_20c;
          fStack_308 = fStack_568 + fStack_208;
          fStack_304 = fStack_564 + fStack_204;
          do {
            auVar74 = _local_820;
            auVar134._8_4_ = 0x7f800000;
            auVar134._0_8_ = 0x7f8000007f800000;
            auVar134._12_4_ = 0x7f800000;
            auVar134._16_4_ = 0x7f800000;
            auVar134._20_4_ = 0x7f800000;
            auVar134._24_4_ = 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar134,_local_3c0);
            auVar108._0_4_ =
                 (uint)(bVar53 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
            bVar56 = (bool)(bVar53 >> 1 & 1);
            auVar108._4_4_ = (uint)bVar56 * auVar88._4_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar53 >> 2 & 1);
            auVar108._8_4_ = (uint)bVar56 * auVar88._8_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar53 >> 3 & 1);
            auVar108._12_4_ = (uint)bVar56 * auVar88._12_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar53 >> 4 & 1);
            auVar108._16_4_ = (uint)bVar56 * auVar88._16_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar53 >> 5 & 1);
            auVar108._20_4_ = (uint)bVar56 * auVar88._20_4_ | (uint)!bVar56 * 0x7f800000;
            bVar56 = (bool)(bVar53 >> 6 & 1);
            auVar108._24_4_ = (uint)bVar56 * auVar88._24_4_ | (uint)!bVar56 * 0x7f800000;
            auVar108._28_4_ =
                 (uint)(bVar53 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar53 >> 7) * 0x7f800000;
            auVar88 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar88 = vminps_avx(auVar108,auVar88);
            auVar73 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar73);
            auVar73 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar73);
            uVar14 = vcmpps_avx512vl(auVar108,auVar88,0);
            bVar47 = (byte)uVar14 & bVar53;
            bVar50 = bVar53;
            if (bVar47 != 0) {
              bVar50 = bVar47;
            }
            iVar17 = 0;
            for (uVar60 = (uint)bVar50; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_540._0_16_ = (undefined1  [16])aVar1;
            auVar65 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar65._0_4_ < 0.0) {
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_300 + (uint)(iVar17 << 2)));
              local_860._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar17 << 2)));
              local_820[1] = 0;
              local_820[0] = bVar53;
              stack0xfffffffffffff7e2 = auVar74._2_30_;
              fVar227 = sqrtf(auVar65._0_4_);
              bVar53 = local_820[0];
              fVar226 = (float)local_840._0_4_;
              uVar199 = local_840._4_4_;
              uVar221 = local_840._8_4_;
              uVar222 = local_840._12_4_;
              fVar225 = (float)local_860._0_4_;
              uVar235 = local_860._4_4_;
              uVar236 = local_860._8_4_;
              uVar237 = local_860._12_4_;
            }
            else {
              auVar65 = vsqrtss_avx(auVar65,auVar65);
              fVar227 = auVar65._0_4_;
              fVar226 = *(float *)(local_300 + (uint)(iVar17 << 2));
              uVar199 = 0;
              uVar221 = 0;
              uVar222 = 0;
              fVar225 = *(float *)(local_200 + (uint)(iVar17 << 2));
              uVar235 = 0;
              uVar236 = 0;
              uVar237 = 0;
            }
            lVar54 = 5;
            do {
              auVar73 = local_840;
              auVar88 = local_860;
              auVar123._4_4_ = fVar225;
              auVar123._0_4_ = fVar225;
              auVar123._8_4_ = fVar225;
              auVar123._12_4_ = fVar225;
              auVar64 = vfmadd132ps_fma(auVar123,ZEXT816(0) << 0x40,local_540._0_16_);
              fVar200 = 1.0 - fVar226;
              auVar165._0_4_ = local_440._0_4_ * fVar226;
              auVar165._4_4_ = local_440._4_4_ * fVar226;
              auVar165._8_4_ = local_440._8_4_ * fVar226;
              auVar165._12_4_ = local_440._12_4_ * fVar226;
              local_490 = ZEXT416((uint)fVar200);
              auVar182._4_4_ = fVar200;
              auVar182._0_4_ = fVar200;
              auVar182._8_4_ = fVar200;
              auVar182._12_4_ = fVar200;
              auVar65 = vfmadd231ps_fma(auVar165,auVar182,local_400._0_16_);
              auVar191._0_4_ = local_420._0_4_ * fVar226;
              auVar191._4_4_ = local_420._4_4_ * fVar226;
              auVar191._8_4_ = local_420._8_4_ * fVar226;
              auVar191._12_4_ = local_420._12_4_ * fVar226;
              auVar68 = vfmadd231ps_fma(auVar191,auVar182,local_440._0_16_);
              auVar198._0_4_ = fVar226 * (float)local_460._0_4_;
              auVar198._4_4_ = fVar226 * (float)local_460._4_4_;
              auVar198._8_4_ = fVar226 * fStack_458;
              auVar198._12_4_ = fVar226 * fStack_454;
              auVar69 = vfmadd231ps_fma(auVar198,auVar182,local_420._0_16_);
              auVar204._0_4_ = fVar226 * auVar68._0_4_;
              auVar204._4_4_ = fVar226 * auVar68._4_4_;
              auVar204._8_4_ = fVar226 * auVar68._8_4_;
              auVar204._12_4_ = fVar226 * auVar68._12_4_;
              auVar65 = vfmadd231ps_fma(auVar204,auVar182,auVar65);
              auVar166._0_4_ = fVar226 * auVar69._0_4_;
              auVar166._4_4_ = fVar226 * auVar69._4_4_;
              auVar166._8_4_ = fVar226 * auVar69._8_4_;
              auVar166._12_4_ = fVar226 * auVar69._12_4_;
              auVar68 = vfmadd231ps_fma(auVar166,auVar182,auVar68);
              auVar192._0_4_ = fVar226 * auVar68._0_4_;
              auVar192._4_4_ = fVar226 * auVar68._4_4_;
              auVar192._8_4_ = fVar226 * auVar68._8_4_;
              auVar192._12_4_ = fVar226 * auVar68._12_4_;
              local_700 = vfmadd231ps_fma(auVar192,auVar65,auVar182);
              auVar65 = vsubps_avx(auVar68,auVar65);
              auVar22._8_4_ = 0x40400000;
              auVar22._0_8_ = 0x4040000040400000;
              auVar22._12_4_ = 0x40400000;
              auVar68 = vmulps_avx512vl(auVar65,auVar22);
              auVar65 = vsubps_avx(auVar64,local_700);
              _local_560 = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              _local_820 = auVar68;
              local_520._0_16_ = auVar65;
              local_840._4_4_ = uVar199;
              local_840._0_4_ = fVar226;
              local_840._8_4_ = uVar221;
              local_840._16_16_ = auVar73._16_16_;
              local_840._12_4_ = uVar222;
              local_860._4_4_ = uVar235;
              local_860._0_4_ = fVar225;
              local_860._8_4_ = uVar236;
              local_860._16_16_ = auVar88._16_16_;
              local_860._12_4_ = uVar237;
              if (auVar65._0_4_ < 0.0) {
                auVar234._0_4_ = sqrtf(auVar65._0_4_);
                auVar234._4_60_ = extraout_var_00;
                auVar65 = auVar234._0_16_;
                auVar68 = _local_820;
              }
              else {
                auVar65 = vsqrtss_avx(auVar65,auVar65);
              }
              local_4a0 = vdpps_avx(auVar68,auVar68,0x7f);
              fVar207 = local_4a0._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar207;
              local_7f0 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              fVar200 = local_7f0._0_4_ * 1.5;
              local_4b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_4a0,auVar23);
              auVar64 = vfnmadd213ss_fma(local_4b0,local_4a0,ZEXT416(0x40000000));
              uVar60 = auVar65._0_4_;
              if (fVar207 < auVar69._0_4_) {
                local_800._0_4_ = fVar200;
                auVar241._0_4_ = sqrtf(fVar207);
                auVar241._4_60_ = extraout_var_01;
                auVar65 = ZEXT416(uVar60);
                auVar69 = auVar241._0_16_;
                auVar68 = _local_820;
              }
              else {
                auVar69 = vsqrtss_avx512f(local_4a0,local_4a0);
                local_800._0_4_ = fVar200;
              }
              fVar200 = local_7f0._0_4_;
              fVar200 = (float)local_800._0_4_ + fVar207 * -0.5 * fVar200 * fVar200 * fVar200;
              local_800._0_4_ = auVar68._0_4_ * fVar200;
              local_800._4_4_ = auVar68._4_4_ * fVar200;
              local_800._8_4_ = auVar68._8_4_ * fVar200;
              local_800._12_4_ = auVar68._12_4_ * fVar200;
              local_7f0 = vdpps_avx(_local_560,local_800,0x7f);
              auVar67 = vaddss_avx512f(auVar65,ZEXT416(0x3f800000));
              auVar124._0_4_ = local_7f0._0_4_ * local_7f0._0_4_;
              auVar124._4_4_ = local_7f0._4_4_ * local_7f0._4_4_;
              auVar124._8_4_ = local_7f0._8_4_ * local_7f0._8_4_;
              auVar124._12_4_ = local_7f0._12_4_ * local_7f0._12_4_;
              auVar66 = vsubps_avx(local_520._0_16_,auVar124);
              fVar207 = auVar66._0_4_;
              auVar144._4_12_ = ZEXT812(0) << 0x20;
              auVar144._0_4_ = fVar207;
              auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar144);
              auVar71 = vmulss_avx512f(auVar70,ZEXT416(0x3fc00000));
              in_ZMM31 = ZEXT1664(auVar71);
              uVar57 = fVar207 == 0.0;
              uVar55 = fVar207 < 0.0;
              if ((bool)uVar55) {
                local_4d0 = fVar200;
                fStack_4cc = fVar200;
                fStack_4c8 = fVar200;
                fStack_4c4 = fVar200;
                local_4c0 = auVar70;
                fVar228 = sqrtf(fVar207);
                in_ZMM31 = ZEXT464(auVar71._0_4_);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar65 = ZEXT416(uVar60);
                auVar67 = ZEXT416(auVar67._0_4_);
                auVar68 = _local_820;
                auVar70 = local_4c0;
                fVar200 = local_4d0;
                fVar208 = fStack_4cc;
                fVar209 = fStack_4c8;
                fVar117 = fStack_4c4;
              }
              else {
                auVar66 = vsqrtss_avx(auVar66,auVar66);
                fVar228 = auVar66._0_4_;
                fVar208 = fVar200;
                fVar209 = fVar200;
                fVar117 = fVar200;
              }
              auVar241 = ZEXT3264(local_6a0);
              auVar234 = ZEXT3264(local_6c0);
              auVar246 = ZEXT3264(local_660);
              auVar249 = ZEXT3264(local_680);
              auVar66 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,local_490);
              fVar210 = auVar66._0_4_ * 6.0;
              fVar211 = local_840._0_4_ * 6.0;
              auVar168._0_4_ = fVar211 * (float)local_460._0_4_;
              auVar168._4_4_ = fVar211 * (float)local_460._4_4_;
              auVar168._8_4_ = fVar211 * fStack_458;
              auVar168._12_4_ = fVar211 * fStack_454;
              auVar145._4_4_ = fVar210;
              auVar145._0_4_ = fVar210;
              auVar145._8_4_ = fVar210;
              auVar145._12_4_ = fVar210;
              auVar66 = vfmadd132ps_fma(auVar145,auVar168,local_420._0_16_);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_490,local_840._0_16_);
              fVar210 = auVar71._0_4_ * 6.0;
              auVar169._4_4_ = fVar210;
              auVar169._0_4_ = fVar210;
              auVar169._8_4_ = fVar210;
              auVar169._12_4_ = fVar210;
              auVar66 = vfmadd132ps_fma(auVar169,auVar66,local_440._0_16_);
              fVar210 = local_490._0_4_ * 6.0;
              auVar146._4_4_ = fVar210;
              auVar146._0_4_ = fVar210;
              auVar146._8_4_ = fVar210;
              auVar146._12_4_ = fVar210;
              auVar66 = vfmadd132ps_fma(auVar146,auVar66,local_400._0_16_);
              auVar170._0_4_ = auVar66._0_4_ * (float)local_4a0._0_4_;
              auVar170._4_4_ = auVar66._4_4_ * (float)local_4a0._0_4_;
              auVar170._8_4_ = auVar66._8_4_ * (float)local_4a0._0_4_;
              auVar170._12_4_ = auVar66._12_4_ * (float)local_4a0._0_4_;
              auVar66 = vdpps_avx(auVar68,auVar66,0x7f);
              fVar210 = auVar66._0_4_;
              auVar147._0_4_ = auVar68._0_4_ * fVar210;
              auVar147._4_4_ = auVar68._4_4_ * fVar210;
              auVar147._8_4_ = auVar68._8_4_ * fVar210;
              auVar147._12_4_ = auVar68._12_4_ * fVar210;
              auVar71 = vsubps_avx(auVar170,auVar147);
              fVar210 = auVar64._0_4_ * (float)local_4b0._0_4_;
              auVar66 = vmaxss_avx(ZEXT416((uint)fVar223),
                                   ZEXT416((uint)((float)local_860._0_4_ * fVar227 * 1.9073486e-06))
                                  );
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(auVar68,auVar24);
              auVar171._0_4_ = fVar200 * auVar71._0_4_ * fVar210;
              auVar171._4_4_ = fVar208 * auVar71._4_4_ * fVar210;
              auVar171._8_4_ = fVar209 * auVar71._8_4_ * fVar210;
              auVar171._12_4_ = fVar117 * auVar71._12_4_ * fVar210;
              auVar64 = vdpps_avx(auVar72,local_800,0x7f);
              auVar71 = vdivss_avx512f(ZEXT416((uint)fVar223),auVar69);
              auVar69 = vfmadd213ss_fma(auVar65,ZEXT416((uint)fVar223),auVar66);
              auVar65 = vdpps_avx(_local_560,auVar171,0x7f);
              vfmadd213ss_avx512f(auVar67,auVar71,auVar69);
              fVar200 = auVar64._0_4_ + auVar65._0_4_;
              auVar65 = vdpps_avx(local_540._0_16_,local_800,0x7f);
              auVar64 = vdpps_avx(_local_560,auVar72,0x7f);
              auVar69 = vmulss_avx512f(auVar70,ZEXT416((uint)(fVar207 * -0.5)));
              auVar70 = vmulss_avx512f(auVar70,auVar70);
              auVar70 = vaddss_avx512f(in_ZMM31._0_16_,
                                       ZEXT416((uint)(auVar69._0_4_ * auVar70._0_4_)));
              auVar69 = vdpps_avx(_local_560,local_540._0_16_,0x7f);
              auVar67 = vfnmadd231ss_avx512f(auVar64,local_7f0,ZEXT416((uint)fVar200));
              auVar71 = vfnmadd231ss_avx512f(auVar69,local_7f0,auVar65);
              auVar64 = vpermilps_avx(local_700,0xff);
              fVar228 = fVar228 - auVar64._0_4_;
              auVar64 = vshufps_avx(auVar68,auVar68,0xff);
              auVar69 = vfmsub213ss_fma(auVar67,auVar70,auVar64);
              fVar207 = auVar71._0_4_ * auVar70._0_4_;
              auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar69._0_4_)),
                                        ZEXT416((uint)fVar200),ZEXT416((uint)fVar207));
              fVar208 = auVar70._0_4_;
              auVar205._0_4_ = fVar207 / fVar208;
              auVar205._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar183._0_4_ = auVar69._0_4_ / fVar208;
              auVar183._4_12_ = auVar69._4_12_;
              auVar69 = vmulss_avx512f(local_7f0,auVar205);
              auVar70 = vmulss_avx512f(local_7f0,auVar183);
              fVar226 = local_840._0_4_ - (auVar69._0_4_ - fVar228 * (auVar65._0_4_ / fVar208));
              uVar199 = 0;
              uVar221 = 0;
              uVar222 = 0;
              fVar225 = (float)local_860._0_4_ - (fVar228 * (fVar200 / fVar208) - auVar70._0_4_);
              auVar193._8_4_ = 0x7fffffff;
              auVar193._0_8_ = 0x7fffffff7fffffff;
              auVar193._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx512vl(local_7f0,auVar193);
              auVar65 = vucomiss_avx512f(auVar65);
              bVar56 = true;
              fVar200 = (float)local_580._0_4_;
              fVar207 = (float)local_580._4_4_;
              fVar208 = fStack_578;
              fVar209 = fStack_574;
              fVar117 = fStack_570;
              fVar210 = fStack_56c;
              fVar211 = fStack_568;
              fVar212 = fStack_564;
              if ((bool)uVar55 || (bool)uVar57) {
LAB_01b8403a:
                uVar237 = 0;
                uVar236 = 0;
                uVar235 = 0;
                auVar252 = ZEXT3264(local_760);
                auVar251 = ZEXT3264(local_740);
                auVar250 = ZEXT3264(local_720);
                auVar243 = ZEXT3264(local_7a0);
                auVar242 = ZEXT3264(local_780);
                auVar247 = ZEXT3264(local_7c0);
              }
              else {
                auVar65 = vaddss_avx512f(auVar66,auVar65);
                auVar69 = vfmadd231ss_fma(auVar65,local_4f0,ZEXT416(0x36000000));
                auVar65 = vandps_avx(ZEXT416((uint)fVar228),auVar193);
                if (auVar69._0_4_ <= auVar65._0_4_) goto LAB_01b8403a;
                fVar225 = fVar225 + (float)local_4e0._0_4_;
                uVar235 = 0;
                uVar236 = 0;
                uVar237 = 0;
                bVar56 = false;
                auVar250 = ZEXT3264(local_720);
                if (fVar225 < (ray->org).field_0.m128[3]) {
                  unaff_R13 = 0;
                  goto LAB_01b8403a;
                }
                fVar228 = ray->tfar;
                auVar251 = ZEXT3264(local_740);
                if (fVar228 < fVar225) {
                  unaff_R13 = 0;
                  goto LAB_01b8403a;
                }
                bVar56 = false;
                auVar242 = ZEXT3264(local_780);
                if (fVar226 < 0.0) {
                  unaff_R13 = 0;
                  goto LAB_01b8403a;
                }
                auVar243 = ZEXT3264(local_7a0);
                if (1.0 < fVar226) {
                  unaff_R13 = 0;
                  goto LAB_01b8403a;
                }
                auVar42._12_4_ = 0;
                auVar42._0_12_ = ZEXT812(0);
                auVar65 = vrsqrt14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)local_520._0_4_));
                fVar229 = auVar65._0_4_;
                pGVar4 = (context->scene->geometries).items[local_868].ptr;
                auVar252 = ZEXT3264(local_760);
                if ((pGVar4->mask & ray->mask) == 0) {
                  bVar56 = false;
                  unaff_R13 = 0;
                  goto LAB_01b8403a;
                }
                auVar247 = ZEXT3264(local_7c0);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  unaff_R13 = 1;
                }
                else {
                  fVar200 = fVar229 * 1.5 +
                            (float)local_520._0_4_ * -0.5 * fVar229 * fVar229 * fVar229;
                  auVar148._0_4_ = local_560._0_4_ * fVar200;
                  auVar148._4_4_ = local_560._4_4_ * fVar200;
                  auVar148._8_4_ = local_560._8_4_ * fVar200;
                  auVar148._12_4_ = local_560._12_4_ * fVar200;
                  auVar69 = vfmadd213ps_fma(auVar64,auVar148,auVar68);
                  auVar65 = vshufps_avx(auVar148,auVar148,0xc9);
                  auVar64 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar149._0_4_ = auVar148._0_4_ * auVar64._0_4_;
                  auVar149._4_4_ = auVar148._4_4_ * auVar64._4_4_;
                  auVar149._8_4_ = auVar148._8_4_ * auVar64._8_4_;
                  auVar149._12_4_ = auVar148._12_4_ * auVar64._12_4_;
                  auVar68 = vfmsub231ps_fma(auVar149,auVar68,auVar65);
                  auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar64 = vshufps_avx(auVar69,auVar69,0xc9);
                  auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                  auVar125._0_4_ = auVar69._0_4_ * auVar68._0_4_;
                  auVar125._4_4_ = auVar69._4_4_ * auVar68._4_4_;
                  auVar125._8_4_ = auVar69._8_4_ * auVar68._8_4_;
                  auVar125._12_4_ = auVar69._12_4_ * auVar68._12_4_;
                  auVar64 = vfmsub231ps_fma(auVar125,auVar65,auVar64);
                  auVar65 = vshufps_avx(auVar64,auVar64,0xe9);
                  local_5d0 = vmovlps_avx(auVar65);
                  local_5c8 = auVar64._0_4_;
                  local_5c0 = 0;
                  local_5bc = (undefined4)local_870;
                  local_5b8 = (undefined4)local_868;
                  local_5b4 = context->user->instID[0];
                  local_5b0 = context->user->instPrimID[0];
                  ray->tfar = fVar225;
                  local_874 = -1;
                  local_6f0.valid = &local_874;
                  local_6f0.geometryUserPtr = pGVar4->userPtr;
                  local_6f0.context = context->user;
                  local_6f0.hit = (RTCHitN *)&local_5d0;
                  local_6f0.N = 1;
                  local_840._0_16_ = ZEXT416((uint)fVar226);
                  local_860._0_16_ = ZEXT416((uint)fVar225);
                  local_820._0_4_ = fVar228;
                  local_6f0.ray = (RTCRayN *)ray;
                  local_5c4 = fVar226;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b8423e:
                    p_Var5 = context->args->filter;
                    fVar200 = (float)local_580._0_4_;
                    fVar207 = (float)local_580._4_4_;
                    fVar208 = fStack_578;
                    fVar209 = fStack_574;
                    fVar117 = fStack_570;
                    fVar210 = fStack_56c;
                    fVar211 = fStack_568;
                    fVar212 = fStack_564;
                    if (p_Var5 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var5)(&local_6f0);
                        auVar249 = ZEXT3264(local_680);
                        auVar246 = ZEXT3264(local_660);
                        auVar247 = ZEXT3264(local_7c0);
                        auVar243 = ZEXT3264(local_7a0);
                        auVar242 = ZEXT3264(local_780);
                        auVar252 = ZEXT3264(local_760);
                        auVar251 = ZEXT3264(local_740);
                        auVar250 = ZEXT3264(local_720);
                        auVar234 = ZEXT3264(local_6c0);
                        auVar241 = ZEXT3264(local_6a0);
                        fVar200 = (float)local_580._0_4_;
                        fVar207 = (float)local_580._4_4_;
                        fVar208 = fStack_578;
                        fVar209 = fStack_574;
                        fVar117 = fStack_570;
                        fVar210 = fStack_56c;
                        fVar211 = fStack_568;
                        fVar212 = fStack_564;
                        fVar228 = (float)local_820._0_4_;
                        fVar226 = (float)local_840._0_4_;
                        uVar199 = local_840._4_4_;
                        uVar221 = local_840._8_4_;
                        uVar222 = local_840._12_4_;
                        fVar225 = (float)local_860._0_4_;
                        uVar235 = local_860._4_4_;
                        uVar236 = local_860._8_4_;
                        uVar237 = local_860._12_4_;
                      }
                      if (*local_6f0.valid == 0) goto LAB_01b8430e;
                    }
                    unaff_R13 = 1;
                  }
                  else {
                    (*pGVar4->occlusionFilterN)(&local_6f0);
                    auVar249 = ZEXT3264(local_680);
                    auVar246 = ZEXT3264(local_660);
                    auVar247 = ZEXT3264(local_7c0);
                    auVar243 = ZEXT3264(local_7a0);
                    auVar242 = ZEXT3264(local_780);
                    auVar252 = ZEXT3264(local_760);
                    auVar251 = ZEXT3264(local_740);
                    auVar250 = ZEXT3264(local_720);
                    auVar234 = ZEXT3264(local_6c0);
                    auVar241 = ZEXT3264(local_6a0);
                    fVar200 = (float)local_580._0_4_;
                    fVar207 = (float)local_580._4_4_;
                    fVar208 = fStack_578;
                    fVar209 = fStack_574;
                    fVar117 = fStack_570;
                    fVar210 = fStack_56c;
                    fVar211 = fStack_568;
                    fVar212 = fStack_564;
                    fVar228 = (float)local_820._0_4_;
                    fVar226 = (float)local_840._0_4_;
                    uVar199 = local_840._4_4_;
                    uVar221 = local_840._8_4_;
                    uVar222 = local_840._12_4_;
                    fVar225 = (float)local_860._0_4_;
                    uVar235 = local_860._4_4_;
                    uVar236 = local_860._8_4_;
                    uVar237 = local_860._12_4_;
                    if (*local_6f0.valid != 0) goto LAB_01b8423e;
LAB_01b8430e:
                    unaff_R13 = 0;
                  }
                  if ((char)unaff_R13 == '\0') {
                    ray->tfar = fVar228;
                  }
                }
                bVar56 = false;
              }
              bVar50 = (byte)unaff_R13;
              if (!bVar56) goto LAB_01b84328;
              lVar54 = lVar54 + -1;
            } while (lVar54 != 0);
            bVar50 = 0;
LAB_01b84328:
            unaff_R13 = (ulong)(bVar50 & 1);
            bVar49 = bVar49 | bVar50 & 1;
            auVar46._4_4_ = fStack_31c;
            auVar46._0_4_ = local_320;
            auVar46._8_4_ = fStack_318;
            auVar46._12_4_ = fStack_314;
            auVar46._16_4_ = fStack_310;
            auVar46._20_4_ = fStack_30c;
            auVar46._24_4_ = fStack_308;
            auVar46._28_4_ = fStack_304;
            fVar225 = ray->tfar;
            auVar32._4_4_ = fVar225;
            auVar32._0_4_ = fVar225;
            auVar32._8_4_ = fVar225;
            auVar32._12_4_ = fVar225;
            auVar32._16_4_ = fVar225;
            auVar32._20_4_ = fVar225;
            auVar32._24_4_ = fVar225;
            auVar32._28_4_ = fVar225;
            uVar14 = vcmpps_avx512vl(auVar46,auVar32,2);
            bVar53 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar53 & (byte)uVar14;
            auVar244 = ZEXT3264(local_600);
          } while (bVar53 != 0);
        }
        uVar15 = vpcmpd_avx512vl(local_2a0,_local_380,1);
        uVar16 = vpcmpd_avx512vl(local_2a0,local_1e0,1);
        auVar152._0_4_ = fVar200 + (float)local_260._0_4_;
        auVar152._4_4_ = fVar207 + (float)local_260._4_4_;
        auVar152._8_4_ = fVar208 + fStack_258;
        auVar152._12_4_ = fVar209 + fStack_254;
        auVar152._16_4_ = fVar117 + fStack_250;
        auVar152._20_4_ = fVar210 + fStack_24c;
        auVar152._24_4_ = fVar211 + fStack_248;
        auVar152._28_4_ = fVar212 + fStack_244;
        fVar223 = ray->tfar;
        auVar175._4_4_ = fVar223;
        auVar175._0_4_ = fVar223;
        auVar175._8_4_ = fVar223;
        auVar175._12_4_ = fVar223;
        auVar175._16_4_ = fVar223;
        auVar175._20_4_ = fVar223;
        auVar175._24_4_ = fVar223;
        auVar175._28_4_ = fVar223;
        uVar14 = vcmpps_avx512vl(auVar152,auVar175,2);
        bVar53 = (byte)local_7c8 & (byte)uVar16 & (byte)uVar14;
        auVar184._0_4_ = fVar200 + (float)local_220._0_4_;
        auVar184._4_4_ = fVar207 + (float)local_220._4_4_;
        auVar184._8_4_ = fVar208 + fStack_218;
        auVar184._12_4_ = fVar209 + fStack_214;
        auVar184._16_4_ = fVar117 + fStack_210;
        auVar184._20_4_ = fVar210 + fStack_20c;
        auVar184._24_4_ = fVar211 + fStack_208;
        auVar184._28_4_ = fVar212 + fStack_204;
        uVar14 = vcmpps_avx512vl(auVar184,auVar175,2);
        bVar51 = bVar51 & (byte)uVar15 & (byte)uVar14 | bVar53;
        if (bVar51 != 0) {
          uVar59 = local_588 & 0xffffffff;
          abStack_180[uVar59 * 0x60] = bVar51;
          bVar56 = (bool)(bVar53 >> 1 & 1);
          bVar6 = (bool)(bVar53 >> 2 & 1);
          bVar7 = (bool)(bVar53 >> 3 & 1);
          bVar8 = (bool)(bVar53 >> 4 & 1);
          bVar9 = (bool)(bVar53 >> 5 & 1);
          bVar10 = (bool)(bVar53 >> 6 & 1);
          auStack_160[uVar59 * 0x18] =
               (uint)(bVar53 & 1) * local_260._0_4_ | (uint)!(bool)(bVar53 & 1) * local_220._0_4_;
          auStack_160[uVar59 * 0x18 + 1] =
               (uint)bVar56 * local_260._4_4_ | (uint)!bVar56 * local_220._4_4_;
          auStack_160[uVar59 * 0x18 + 2] =
               (uint)bVar6 * (int)fStack_258 | (uint)!bVar6 * (int)fStack_218;
          auStack_160[uVar59 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_254 | (uint)!bVar7 * (int)fStack_214;
          auStack_160[uVar59 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_250 | (uint)!bVar8 * (int)fStack_210;
          afStack_140[uVar59 * 0x18 + -3] =
               (float)((uint)bVar9 * (int)fStack_24c | (uint)!bVar9 * (int)fStack_20c);
          afStack_140[uVar59 * 0x18 + -2] =
               (float)((uint)bVar10 * (int)fStack_248 | (uint)!bVar10 * (int)fStack_208);
          afStack_140[uVar59 * 0x18 + -1] =
               (float)((uint)(bVar53 >> 7) * (int)fStack_244 |
                      (uint)!(bool)(bVar53 >> 7) * (int)fStack_204);
          uVar14 = vmovlps_avx(local_500);
          *(undefined8 *)(afStack_140 + uVar59 * 0x18) = uVar14;
          auStack_138[uVar59 * 0x18] = (int)local_7d8 + 1;
          local_588 = (ulong)((int)local_588 + 1);
        }
        auVar185 = ZEXT3264(local_480);
        auVar245 = ZEXT3264(local_620);
        auVar248 = ZEXT3264(local_640);
        auVar232 = ZEXT3264(local_3e0);
        prim = local_598;
      }
    }
    fVar223 = ray->tfar;
    auVar135._4_4_ = fVar223;
    auVar135._0_4_ = fVar223;
    auVar135._8_4_ = fVar223;
    auVar135._12_4_ = fVar223;
    auVar135._16_4_ = fVar223;
    auVar135._20_4_ = fVar223;
    auVar135._24_4_ = fVar223;
    auVar135._28_4_ = fVar223;
    uVar59 = local_588;
    do {
      if ((int)uVar59 == 0) {
        if (bVar49 != 0) {
          return bVar58;
        }
        fVar200 = ray->tfar;
        auVar25._4_4_ = fVar200;
        auVar25._0_4_ = fVar200;
        auVar25._8_4_ = fVar200;
        auVar25._12_4_ = fVar200;
        uVar14 = vcmpps_avx512vl(local_2b0,auVar25,2);
        uVar60 = (uint)local_590 & (uint)uVar14;
        local_590 = (ulong)uVar60;
        bVar58 = uVar60 != 0;
        if (!bVar58) {
          return bVar58;
        }
        goto LAB_01b81f4d;
      }
      uVar52 = (ulong)((int)uVar59 - 1);
      auVar88 = *(undefined1 (*) [32])(auStack_160 + uVar52 * 0x18);
      auVar176._0_4_ = fVar200 + auVar88._0_4_;
      auVar176._4_4_ = fVar207 + auVar88._4_4_;
      auVar176._8_4_ = fVar208 + auVar88._8_4_;
      auVar176._12_4_ = fVar209 + auVar88._12_4_;
      auVar176._16_4_ = fVar117 + auVar88._16_4_;
      auVar176._20_4_ = fVar210 + auVar88._20_4_;
      auVar176._24_4_ = fVar211 + auVar88._24_4_;
      auVar176._28_4_ = fVar212 + auVar88._28_4_;
      uVar14 = vcmpps_avx512vl(auVar176,auVar135,2);
      uVar60 = (uint)uVar14 & (uint)abStack_180[uVar52 * 0x60];
      bVar51 = (byte)uVar60;
      local_588 = uVar52;
      if (uVar60 != 0) {
        auVar177._8_4_ = 0x7f800000;
        auVar177._0_8_ = 0x7f8000007f800000;
        auVar177._12_4_ = 0x7f800000;
        auVar177._16_4_ = 0x7f800000;
        auVar177._20_4_ = 0x7f800000;
        auVar177._24_4_ = 0x7f800000;
        auVar177._28_4_ = 0x7f800000;
        auVar73 = vblendmps_avx512vl(auVar177,auVar88);
        auVar109._0_4_ =
             (uint)(bVar51 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar51 & 1) * (int)auVar88._0_4_;
        bVar56 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar56 * auVar73._4_4_ | (uint)!bVar56 * (int)auVar88._4_4_;
        bVar56 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar56 * auVar73._8_4_ | (uint)!bVar56 * (int)auVar88._8_4_;
        bVar56 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar56 * auVar73._12_4_ | (uint)!bVar56 * (int)auVar88._12_4_;
        bVar56 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar109._16_4_ = (uint)bVar56 * auVar73._16_4_ | (uint)!bVar56 * (int)auVar88._16_4_;
        bVar56 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar109._20_4_ = (uint)bVar56 * auVar73._20_4_ | (uint)!bVar56 * (int)auVar88._20_4_;
        bVar56 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar109._24_4_ = (uint)bVar56 * auVar73._24_4_ | (uint)!bVar56 * (int)auVar88._24_4_;
        auVar109._28_4_ =
             (uVar60 >> 7) * auVar73._28_4_ | (uint)!SUB41(uVar60 >> 7,0) * (int)auVar88._28_4_;
        auVar88 = vshufps_avx(auVar109,auVar109,0xb1);
        auVar88 = vminps_avx(auVar109,auVar88);
        auVar73 = vshufpd_avx(auVar88,auVar88,5);
        auVar88 = vminps_avx(auVar88,auVar73);
        auVar73 = vpermpd_avx2(auVar88,0x4e);
        auVar88 = vminps_avx(auVar88,auVar73);
        uVar14 = vcmpps_avx512vl(auVar109,auVar88,0);
        bVar53 = (byte)uVar14 & bVar51;
        if (bVar53 != 0) {
          uVar60 = (uint)bVar53;
        }
        fVar223 = afStack_140[uVar52 * 0x18 + 1];
        uVar110 = 0;
        for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
          uVar110 = uVar110 + 1;
        }
        unaff_R13 = (ulong)auStack_138[uVar52 * 0x18];
        bVar53 = ~('\x01' << ((byte)uVar110 & 0x1f)) & bVar51;
        abStack_180[uVar52 * 0x60] = bVar53;
        auVar185 = ZEXT3264(local_480);
        if (bVar53 != 0) {
          local_588 = uVar59 & 0xffffffff;
        }
        fVar225 = afStack_140[uVar52 * 0x18];
        auVar178._4_4_ = fVar225;
        auVar178._0_4_ = fVar225;
        auVar178._8_4_ = fVar225;
        auVar178._12_4_ = fVar225;
        auVar178._16_4_ = fVar225;
        auVar178._20_4_ = fVar225;
        auVar178._24_4_ = fVar225;
        auVar178._28_4_ = fVar225;
        fVar223 = fVar223 - fVar225;
        auVar153._4_4_ = fVar223;
        auVar153._0_4_ = fVar223;
        auVar153._8_4_ = fVar223;
        auVar153._12_4_ = fVar223;
        auVar153._16_4_ = fVar223;
        auVar153._20_4_ = fVar223;
        auVar153._24_4_ = fVar223;
        auVar153._28_4_ = fVar223;
        auVar65 = vfmadd132ps_fma(auVar153,auVar178,_DAT_02020f20);
        _local_260 = ZEXT1632(auVar65);
        local_500._8_8_ = 0;
        local_500._0_8_ = *(ulong *)(local_260 + (ulong)uVar110 * 4);
        local_7d8 = unaff_R13;
      }
      uVar59 = local_588;
    } while (bVar51 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }